

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [60];
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  byte bVar43;
  uint uVar44;
  ulong uVar45;
  long lVar47;
  uint uVar48;
  ulong uVar49;
  ulong uVar50;
  uint uVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  ulong uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined1 auVar107 [64];
  undefined1 auVar109 [64];
  undefined1 auVar111 [64];
  undefined1 auVar113 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  float fVar118;
  vint4 bi_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [64];
  float fVar126;
  undefined4 uVar127;
  float fVar133;
  float fVar134;
  vint4 bi_1;
  undefined1 auVar128 [16];
  float fVar135;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  vint4 bi;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  vint4 ai_2;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  vint4 ai;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  vint4 ai_1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  vfloat4 a0_3;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  __m128 a_1;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  __m128 a;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  float fVar216;
  float fVar225;
  float fVar226;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar227;
  float fVar228;
  float fVar239;
  float fVar240;
  vfloat4 a0_1;
  undefined1 auVar229 [16];
  float fVar241;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar242;
  float fVar248;
  float fVar249;
  vfloat4 a0;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar250;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  uint local_678;
  RTCFilterFunctionNArguments local_670;
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  uint auStack_610 [4];
  undefined1 local_600 [16];
  undefined1 local_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined8 uStack_460;
  undefined1 local_440 [64];
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar46;
  undefined1 auVar106 [64];
  undefined1 auVar108 [64];
  undefined1 auVar110 [64];
  undefined1 auVar112 [64];
  undefined1 auVar114 [64];
  float fVar152;
  float fVar158;
  float fVar159;
  float fVar168;
  
  PVar3 = prim[1];
  uVar49 = (ulong)(byte)PVar3;
  fVar118 = *(float *)(prim + uVar49 * 0x19 + 0x12);
  auVar57 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar57 = vinsertps_avx(auVar57,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar58 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar58 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar57 = vsubps_avx(auVar57,*(undefined1 (*) [16])(prim + uVar49 * 0x19 + 6));
  auVar78._0_4_ = fVar118 * auVar57._0_4_;
  auVar78._4_4_ = fVar118 * auVar57._4_4_;
  auVar78._8_4_ = fVar118 * auVar57._8_4_;
  auVar78._12_4_ = fVar118 * auVar57._12_4_;
  auVar66._0_4_ = fVar118 * auVar58._0_4_;
  auVar66._4_4_ = fVar118 * auVar58._4_4_;
  auVar66._8_4_ = fVar118 * auVar58._8_4_;
  auVar66._12_4_ = fVar118 * auVar58._12_4_;
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 4 + 6)));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 5 + 6)));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar59 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 6 + 6)));
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xb + 6)));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar49 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  uVar56 = (ulong)(uint)((int)(uVar49 * 9) * 2);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + uVar49 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  uVar45 = (ulong)(uint)((int)(uVar49 * 5) << 2);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar45 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar82._4_4_ = auVar66._0_4_;
  auVar82._0_4_ = auVar66._0_4_;
  auVar82._8_4_ = auVar66._0_4_;
  auVar82._12_4_ = auVar66._0_4_;
  auVar61 = vshufps_avx(auVar66,auVar66,0x55);
  auVar60 = vshufps_avx(auVar66,auVar66,0xaa);
  fVar118 = auVar60._0_4_;
  auVar75._0_4_ = fVar118 * auVar59._0_4_;
  fVar227 = auVar60._4_4_;
  auVar75._4_4_ = fVar227 * auVar59._4_4_;
  fVar216 = auVar60._8_4_;
  auVar75._8_4_ = fVar216 * auVar59._8_4_;
  fVar225 = auVar60._12_4_;
  auVar75._12_4_ = fVar225 * auVar59._12_4_;
  auVar79._0_4_ = auVar65._0_4_ * fVar118;
  auVar79._4_4_ = auVar65._4_4_ * fVar227;
  auVar79._8_4_ = auVar65._8_4_ * fVar216;
  auVar79._12_4_ = auVar65._12_4_ * fVar225;
  auVar67._0_4_ = auVar62._0_4_ * fVar118;
  auVar67._4_4_ = auVar62._4_4_ * fVar227;
  auVar67._8_4_ = auVar62._8_4_ * fVar216;
  auVar67._12_4_ = auVar62._12_4_ * fVar225;
  auVar60 = vfmadd231ps_fma(auVar75,auVar61,auVar58);
  auVar63 = vfmadd231ps_fma(auVar79,auVar61,auVar69);
  auVar61 = vfmadd231ps_fma(auVar67,auVar70,auVar61);
  auVar64 = vfmadd231ps_fma(auVar60,auVar82,auVar57);
  auVar63 = vfmadd231ps_fma(auVar63,auVar82,auVar68);
  auVar66 = vfmadd231ps_fma(auVar61,auVar71,auVar82);
  auVar243._4_4_ = auVar78._0_4_;
  auVar243._0_4_ = auVar78._0_4_;
  auVar243._8_4_ = auVar78._0_4_;
  auVar243._12_4_ = auVar78._0_4_;
  auVar61 = vshufps_avx(auVar78,auVar78,0x55);
  auVar60 = vshufps_avx(auVar78,auVar78,0xaa);
  fVar118 = auVar60._0_4_;
  auVar254._0_4_ = fVar118 * auVar59._0_4_;
  fVar227 = auVar60._4_4_;
  auVar254._4_4_ = fVar227 * auVar59._4_4_;
  fVar216 = auVar60._8_4_;
  auVar254._8_4_ = fVar216 * auVar59._8_4_;
  fVar225 = auVar60._12_4_;
  auVar254._12_4_ = fVar225 * auVar59._12_4_;
  auVar83._0_4_ = auVar65._0_4_ * fVar118;
  auVar83._4_4_ = auVar65._4_4_ * fVar227;
  auVar83._8_4_ = auVar65._8_4_ * fVar216;
  auVar83._12_4_ = auVar65._12_4_ * fVar225;
  auVar77._0_4_ = auVar62._0_4_ * fVar118;
  auVar77._4_4_ = auVar62._4_4_ * fVar227;
  auVar77._8_4_ = auVar62._8_4_ * fVar216;
  auVar77._12_4_ = auVar62._12_4_ * fVar225;
  auVar58 = vfmadd231ps_fma(auVar254,auVar61,auVar58);
  auVar59 = vfmadd231ps_fma(auVar83,auVar61,auVar69);
  auVar69 = vfmadd231ps_fma(auVar77,auVar61,auVar70);
  auVar65 = vfmadd231ps_fma(auVar58,auVar243,auVar57);
  auVar70 = vfmadd231ps_fma(auVar59,auVar243,auVar68);
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar264 = ZEXT1664(auVar57);
  auVar62 = vfmadd231ps_fma(auVar69,auVar243,auVar71);
  auVar58 = vandps_avx512vl(auVar64,auVar57);
  auVar74._8_4_ = 0x219392ef;
  auVar74._0_8_ = 0x219392ef219392ef;
  auVar74._12_4_ = 0x219392ef;
  uVar56 = vcmpps_avx512vl(auVar58,auVar74,1);
  bVar54 = (bool)((byte)uVar56 & 1);
  auVar60._0_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar64._0_4_;
  bVar54 = (bool)((byte)(uVar56 >> 1) & 1);
  auVar60._4_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar64._4_4_;
  bVar54 = (bool)((byte)(uVar56 >> 2) & 1);
  auVar60._8_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar64._8_4_;
  bVar54 = (bool)((byte)(uVar56 >> 3) & 1);
  auVar60._12_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar64._12_4_;
  auVar58 = vandps_avx512vl(auVar63,auVar57);
  uVar56 = vcmpps_avx512vl(auVar58,auVar74,1);
  bVar54 = (bool)((byte)uVar56 & 1);
  auVar64._0_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar63._0_4_;
  bVar54 = (bool)((byte)(uVar56 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar63._4_4_;
  bVar54 = (bool)((byte)(uVar56 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar63._8_4_;
  bVar54 = (bool)((byte)(uVar56 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar63._12_4_;
  auVar57 = vandps_avx512vl(auVar66,auVar57);
  uVar56 = vcmpps_avx512vl(auVar57,auVar74,1);
  bVar54 = (bool)((byte)uVar56 & 1);
  auVar63._0_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar66._0_4_;
  bVar54 = (bool)((byte)(uVar56 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar66._4_4_;
  bVar54 = (bool)((byte)(uVar56 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar66._8_4_;
  bVar54 = (bool)((byte)(uVar56 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar54 * 0x219392ef | (uint)!bVar54 * auVar66._12_4_;
  auVar57 = vrcp14ps_avx512vl(auVar60);
  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar265 = ZEXT1664(auVar58);
  auVar59 = vfnmadd213ps_avx512vl(auVar60,auVar57,auVar58);
  auVar68 = vfmadd132ps_fma(auVar59,auVar57,auVar57);
  auVar57 = vrcp14ps_avx512vl(auVar64);
  auVar59 = vfnmadd213ps_avx512vl(auVar64,auVar57,auVar58);
  auVar69 = vfmadd132ps_fma(auVar59,auVar57,auVar57);
  auVar57 = vrcp14ps_avx512vl(auVar63);
  auVar58 = vfnmadd213ps_avx512vl(auVar63,auVar57,auVar58);
  auVar71 = vfmadd132ps_fma(auVar58,auVar57,auVar57);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar49 * 7 + 6);
  auVar57 = vpmovsxwd_avx(auVar57);
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar57 = vsubps_avx(auVar57,auVar65);
  auVar73._0_4_ = auVar68._0_4_ * auVar57._0_4_;
  auVar73._4_4_ = auVar68._4_4_ * auVar57._4_4_;
  auVar73._8_4_ = auVar68._8_4_ * auVar57._8_4_;
  auVar73._12_4_ = auVar68._12_4_ * auVar57._12_4_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar49 * 9 + 6);
  auVar57 = vpmovsxwd_avx(auVar58);
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar57 = vsubps_avx(auVar57,auVar65);
  auVar60 = vpbroadcastd_avx512vl();
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar58 = vpmovsxwd_avx(auVar59);
  auVar76._0_4_ = auVar68._0_4_ * auVar57._0_4_;
  auVar76._4_4_ = auVar68._4_4_ * auVar57._4_4_;
  auVar76._8_4_ = auVar68._8_4_ * auVar57._8_4_;
  auVar76._12_4_ = auVar68._12_4_ * auVar57._12_4_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar49 * -2 + 6);
  auVar57 = vpmovsxwd_avx(auVar68);
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar57 = vsubps_avx(auVar57,auVar70);
  auVar81._0_4_ = auVar69._0_4_ * auVar57._0_4_;
  auVar81._4_4_ = auVar69._4_4_ * auVar57._4_4_;
  auVar81._8_4_ = auVar69._8_4_ * auVar57._8_4_;
  auVar81._12_4_ = auVar69._12_4_ * auVar57._12_4_;
  auVar57 = vcvtdq2ps_avx(auVar58);
  auVar57 = vsubps_avx(auVar57,auVar70);
  auVar80._0_4_ = auVar69._0_4_ * auVar57._0_4_;
  auVar80._4_4_ = auVar69._4_4_ * auVar57._4_4_;
  auVar80._8_4_ = auVar69._8_4_ * auVar57._8_4_;
  auVar80._12_4_ = auVar69._12_4_ * auVar57._12_4_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar45 + uVar49 + 6);
  auVar57 = vpmovsxwd_avx(auVar69);
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar57 = vsubps_avx(auVar57,auVar62);
  auVar153._0_4_ = auVar71._0_4_ * auVar57._0_4_;
  auVar153._4_4_ = auVar71._4_4_ * auVar57._4_4_;
  auVar153._8_4_ = auVar71._8_4_ * auVar57._8_4_;
  auVar153._12_4_ = auVar71._12_4_ * auVar57._12_4_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar49 * 0x17 + 6);
  auVar57 = vpmovsxwd_avx(auVar65);
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar57 = vsubps_avx(auVar57,auVar62);
  auVar72._0_4_ = auVar71._0_4_ * auVar57._0_4_;
  auVar72._4_4_ = auVar71._4_4_ * auVar57._4_4_;
  auVar72._8_4_ = auVar71._8_4_ * auVar57._8_4_;
  auVar72._12_4_ = auVar71._12_4_ * auVar57._12_4_;
  auVar57 = vpminsd_avx(auVar73,auVar76);
  auVar58 = vpminsd_avx(auVar81,auVar80);
  auVar57 = vmaxps_avx(auVar57,auVar58);
  auVar58 = vpminsd_avx(auVar153,auVar72);
  uVar127 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar71._4_4_ = uVar127;
  auVar71._0_4_ = uVar127;
  auVar71._8_4_ = uVar127;
  auVar71._12_4_ = uVar127;
  auVar58 = vmaxps_avx512vl(auVar58,auVar71);
  auVar57 = vmaxps_avx(auVar57,auVar58);
  auVar70._8_4_ = 0x3f7ffffa;
  auVar70._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar70._12_4_ = 0x3f7ffffa;
  local_600 = vmulps_avx512vl(auVar57,auVar70);
  auVar57 = vpmaxsd_avx(auVar73,auVar76);
  auVar58 = vpmaxsd_avx(auVar81,auVar80);
  auVar57 = vminps_avx(auVar57,auVar58);
  auVar58 = vpmaxsd_avx(auVar153,auVar72);
  uVar127 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar62._4_4_ = uVar127;
  auVar62._0_4_ = uVar127;
  auVar62._8_4_ = uVar127;
  auVar62._12_4_ = uVar127;
  auVar58 = vminps_avx512vl(auVar58,auVar62);
  auVar57 = vminps_avx(auVar57,auVar58);
  auVar61._8_4_ = 0x3f800003;
  auVar61._0_8_ = 0x3f8000033f800003;
  auVar61._12_4_ = 0x3f800003;
  auVar57 = vmulps_avx512vl(auVar57,auVar61);
  uVar21 = vcmpps_avx512vl(local_600,auVar57,2);
  uVar56 = vpcmpgtd_avx512vl(auVar60,_DAT_01f7fcf0);
  uVar56 = ((byte)uVar21 & 0xf) & uVar56;
  if ((char)uVar56 != '\0') {
    auVar125 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_380 = vmovdqa64_avx512f(auVar125);
    auVar57 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar125 = ZEXT1664(auVar57);
    auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar260 = ZEXT1664(auVar57);
    auVar267 = ZEXT464(0x3f800000);
    do {
      lVar47 = 0;
      for (uVar45 = uVar56; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
        lVar47 = lVar47 + 1;
      }
      uVar51 = *(uint *)(prim + 2);
      uVar4 = *(uint *)(prim + lVar47 * 4 + 6);
      pGVar6 = (context->scene->geometries).items[uVar51].ptr;
      lVar7 = *(long *)&pGVar6[1].time_range.upper;
      uVar45 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                               (ulong)uVar4 *
                               pGVar6[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      auVar57 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar45);
      lVar47 = uVar45 + 1;
      auVar58 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar47);
      _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar59 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar45);
      auVar68 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar47);
      auVar69 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      auVar69 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      fVar118 = *(float *)(ray + k * 4 + 0xc0);
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
      auVar62 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar45
                            ),auVar57,auVar61);
      auVar60 = vfnmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar47
                            ),auVar58,auVar61);
      auVar63 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            ((long)pGVar6[3].userPtr + uVar45 * *(long *)&pGVar6[3].fnumTimeSegments
                            ),auVar59,auVar61);
      auVar64 = vfnmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar47
                            ),auVar68,auVar61);
      auVar72 = ZEXT816(0) << 0x40;
      auVar128._0_4_ = auVar58._0_4_ * 0.0;
      auVar128._4_4_ = auVar58._4_4_ * 0.0;
      auVar128._8_4_ = auVar58._8_4_ * 0.0;
      auVar128._12_4_ = auVar58._12_4_ * 0.0;
      auVar71 = vfmadd231ps_fma(auVar128,auVar60,auVar72);
      auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar62,auVar71);
      auVar136._0_4_ = auVar57._0_4_ + auVar65._0_4_;
      auVar136._4_4_ = auVar57._4_4_ + auVar65._4_4_;
      auVar136._8_4_ = auVar57._8_4_ + auVar65._8_4_;
      auVar136._12_4_ = auVar57._12_4_ + auVar65._12_4_;
      auVar79 = auVar125._0_16_;
      auVar65 = vfmadd231ps_avx512vl(auVar71,auVar62,auVar79);
      auVar66 = vfnmadd231ps_avx512vl(auVar65,auVar57,auVar79);
      auVar229._0_4_ = auVar68._0_4_ * 0.0;
      auVar229._4_4_ = auVar68._4_4_ * 0.0;
      auVar229._8_4_ = auVar68._8_4_ * 0.0;
      auVar229._12_4_ = auVar68._12_4_ * 0.0;
      auVar71 = vfmadd231ps_fma(auVar229,auVar64,auVar72);
      auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar63,auVar71);
      auVar244._0_4_ = auVar59._0_4_ + auVar65._0_4_;
      auVar244._4_4_ = auVar59._4_4_ + auVar65._4_4_;
      auVar244._8_4_ = auVar59._8_4_ + auVar65._8_4_;
      auVar244._12_4_ = auVar59._12_4_ + auVar65._12_4_;
      auVar65 = vfmadd231ps_avx512vl(auVar71,auVar63,auVar79);
      auVar67 = vfnmadd231ps_avx512vl(auVar65,auVar59,auVar79);
      auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar60,auVar58);
      auVar65 = vfmadd231ps_fma(auVar65,auVar62,auVar72);
      auVar70 = vfmadd231ps_fma(auVar65,auVar57,auVar72);
      auVar58 = vmulps_avx512vl(auVar58,auVar79);
      auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar79,auVar60);
      auVar58 = vfmadd231ps_fma(auVar58,auVar72,auVar62);
      auVar62 = vfnmadd231ps_fma(auVar58,auVar72,auVar57);
      auVar57 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar64,auVar68);
      auVar57 = vfmadd231ps_fma(auVar57,auVar63,auVar72);
      auVar65 = vfmadd231ps_fma(auVar57,auVar59,auVar72);
      auVar57 = vmulps_avx512vl(auVar68,auVar79);
      auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar79,auVar64);
      auVar57 = vfmadd231ps_fma(auVar57,auVar72,auVar63);
      auVar71 = vfnmadd231ps_fma(auVar57,auVar72,auVar59);
      auVar57 = vshufps_avx(auVar66,auVar66,0xc9);
      auVar58 = vshufps_avx(auVar244,auVar244,0xc9);
      fVar126 = auVar66._0_4_;
      auVar180._0_4_ = fVar126 * auVar58._0_4_;
      fVar133 = auVar66._4_4_;
      auVar180._4_4_ = fVar133 * auVar58._4_4_;
      fVar134 = auVar66._8_4_;
      auVar180._8_4_ = fVar134 * auVar58._8_4_;
      fVar135 = auVar66._12_4_;
      auVar180._12_4_ = fVar135 * auVar58._12_4_;
      auVar58 = vfmsub231ps_fma(auVar180,auVar57,auVar244);
      auVar59 = vshufps_avx(auVar58,auVar58,0xc9);
      auVar58 = vshufps_avx(auVar67,auVar67,0xc9);
      auVar199._0_4_ = auVar58._0_4_ * fVar126;
      auVar199._4_4_ = auVar58._4_4_ * fVar133;
      auVar199._8_4_ = auVar58._8_4_ * fVar134;
      auVar199._12_4_ = auVar58._12_4_ * fVar135;
      auVar57 = vfmsub231ps_fma(auVar199,auVar57,auVar67);
      auVar68 = vshufps_avx(auVar57,auVar57,0xc9);
      auVar57 = vshufps_avx(auVar62,auVar62,0xc9);
      auVar58 = vshufps_avx(auVar65,auVar65,0xc9);
      fVar227 = auVar62._0_4_;
      auVar209._0_4_ = auVar58._0_4_ * fVar227;
      fVar216 = auVar62._4_4_;
      auVar209._4_4_ = auVar58._4_4_ * fVar216;
      fVar225 = auVar62._8_4_;
      auVar209._8_4_ = auVar58._8_4_ * fVar225;
      fVar226 = auVar62._12_4_;
      auVar209._12_4_ = auVar58._12_4_ * fVar226;
      auVar58 = vfmsub231ps_fma(auVar209,auVar57,auVar65);
      auVar65 = vshufps_avx(auVar58,auVar58,0xc9);
      auVar58 = vshufps_avx(auVar71,auVar71,0xc9);
      auVar210._0_4_ = auVar58._0_4_ * fVar227;
      auVar210._4_4_ = auVar58._4_4_ * fVar216;
      auVar210._8_4_ = auVar58._8_4_ * fVar225;
      auVar210._12_4_ = auVar58._12_4_ * fVar226;
      auVar57 = vfmsub231ps_fma(auVar210,auVar57,auVar71);
      auVar71 = vshufps_avx(auVar57,auVar57,0xc9);
      auVar57 = vdpps_avx(auVar59,auVar59,0x7f);
      fVar152 = auVar57._0_4_;
      auVar211._4_12_ = ZEXT812(0) << 0x20;
      auVar211._0_4_ = fVar152;
      auVar58 = vrsqrt14ss_avx512f(auVar72,auVar211);
      auVar60 = vmulss_avx512f(auVar58,ZEXT416(0x3fc00000));
      auVar63 = vmulss_avx512f(auVar57,ZEXT416(0x3f000000));
      fVar158 = auVar58._0_4_;
      fVar159 = auVar60._0_4_ - auVar63._0_4_ * fVar158 * fVar158 * fVar158;
      auVar58 = vdpps_avx(auVar59,auVar68,0x7f);
      fVar242 = fVar159 * auVar59._0_4_;
      fVar248 = fVar159 * auVar59._4_4_;
      fVar249 = fVar159 * auVar59._8_4_;
      fVar250 = fVar159 * auVar59._12_4_;
      auVar200._0_4_ = fVar152 * auVar68._0_4_;
      auVar200._4_4_ = fVar152 * auVar68._4_4_;
      auVar200._8_4_ = fVar152 * auVar68._8_4_;
      auVar200._12_4_ = fVar152 * auVar68._12_4_;
      fVar152 = auVar58._0_4_;
      auVar181._0_4_ = fVar152 * auVar59._0_4_;
      auVar181._4_4_ = fVar152 * auVar59._4_4_;
      auVar181._8_4_ = fVar152 * auVar59._8_4_;
      auVar181._12_4_ = fVar152 * auVar59._12_4_;
      auVar59 = vsubps_avx(auVar200,auVar181);
      auVar58 = vrcp14ss_avx512f(auVar72,auVar211);
      auVar57 = vfnmadd213ss_avx512f(auVar57,auVar58,ZEXT416(0x40000000));
      fVar152 = auVar58._0_4_ * auVar57._0_4_;
      auVar57 = vdpps_avx(auVar65,auVar65,0x7f);
      fVar158 = auVar57._0_4_;
      auVar201._4_12_ = ZEXT812(0) << 0x20;
      auVar201._0_4_ = fVar158;
      auVar58 = vrsqrt14ss_avx512f(auVar72,auVar201);
      auVar68 = vmulss_avx512f(auVar58,ZEXT416(0x3fc00000));
      auVar60 = vmulss_avx512f(auVar57,ZEXT416(0x3f000000));
      fVar168 = auVar58._0_4_;
      fVar168 = auVar68._0_4_ - auVar60._0_4_ * fVar168 * fVar168 * fVar168;
      auVar58 = vdpps_avx(auVar65,auVar71,0x7f);
      fVar228 = fVar168 * auVar65._0_4_;
      fVar239 = fVar168 * auVar65._4_4_;
      fVar240 = fVar168 * auVar65._8_4_;
      fVar241 = fVar168 * auVar65._12_4_;
      auVar169._0_4_ = fVar158 * auVar71._0_4_;
      auVar169._4_4_ = fVar158 * auVar71._4_4_;
      auVar169._8_4_ = fVar158 * auVar71._8_4_;
      auVar169._12_4_ = fVar158 * auVar71._12_4_;
      fVar158 = auVar58._0_4_;
      auVar160._0_4_ = fVar158 * auVar65._0_4_;
      auVar160._4_4_ = fVar158 * auVar65._4_4_;
      auVar160._8_4_ = fVar158 * auVar65._8_4_;
      auVar160._12_4_ = fVar158 * auVar65._12_4_;
      auVar68 = vsubps_avx(auVar169,auVar160);
      auVar58 = vrcp14ss_avx512f(auVar72,auVar201);
      auVar57 = vfnmadd213ss_avx512f(auVar57,auVar58,ZEXT416(0x40000000));
      fVar158 = auVar57._0_4_ * auVar58._0_4_;
      auVar57 = vshufps_avx(auVar136,auVar136,0xff);
      auVar187._0_4_ = fVar242 * auVar57._0_4_;
      auVar187._4_4_ = fVar248 * auVar57._4_4_;
      auVar187._8_4_ = fVar249 * auVar57._8_4_;
      auVar187._12_4_ = fVar250 * auVar57._12_4_;
      local_540 = vsubps_avx(auVar136,auVar187);
      auVar58 = vshufps_avx(auVar66,auVar66,0xff);
      auVar170._0_4_ = auVar58._0_4_ * fVar242 + auVar57._0_4_ * fVar159 * fVar152 * auVar59._0_4_;
      auVar170._4_4_ = auVar58._4_4_ * fVar248 + auVar57._4_4_ * fVar159 * fVar152 * auVar59._4_4_;
      auVar170._8_4_ = auVar58._8_4_ * fVar249 + auVar57._8_4_ * fVar159 * fVar152 * auVar59._8_4_;
      auVar170._12_4_ =
           auVar58._12_4_ * fVar250 + auVar57._12_4_ * fVar159 * fVar152 * auVar59._12_4_;
      auVar59 = vsubps_avx(auVar66,auVar170);
      local_550._0_4_ = auVar187._0_4_ + auVar136._0_4_;
      local_550._4_4_ = auVar187._4_4_ + auVar136._4_4_;
      fStack_548 = auVar187._8_4_ + auVar136._8_4_;
      fStack_544 = auVar187._12_4_ + auVar136._12_4_;
      auVar129._0_4_ = fVar126 + auVar170._0_4_;
      auVar129._4_4_ = fVar133 + auVar170._4_4_;
      auVar129._8_4_ = fVar134 + auVar170._8_4_;
      auVar129._12_4_ = fVar135 + auVar170._12_4_;
      auVar57 = vshufps_avx(auVar70,auVar70,0xff);
      auVar171._0_4_ = fVar228 * auVar57._0_4_;
      auVar171._4_4_ = fVar239 * auVar57._4_4_;
      auVar171._8_4_ = fVar240 * auVar57._8_4_;
      auVar171._12_4_ = fVar241 * auVar57._12_4_;
      local_560 = vsubps_avx(auVar70,auVar171);
      auVar58 = vshufps_avx(auVar62,auVar62,0xff);
      auVar137._0_4_ = auVar58._0_4_ * fVar228 + auVar57._0_4_ * fVar168 * auVar68._0_4_ * fVar158;
      auVar137._4_4_ = auVar58._4_4_ * fVar239 + auVar57._4_4_ * fVar168 * auVar68._4_4_ * fVar158;
      auVar137._8_4_ = auVar58._8_4_ * fVar240 + auVar57._8_4_ * fVar168 * auVar68._8_4_ * fVar158;
      auVar137._12_4_ =
           auVar58._12_4_ * fVar241 + auVar57._12_4_ * fVar168 * auVar68._12_4_ * fVar158;
      auVar57 = vsubps_avx(auVar62,auVar137);
      _local_570 = vaddps_avx512vl(auVar70,auVar171);
      auVar138._0_4_ = fVar227 + auVar137._0_4_;
      auVar138._4_4_ = fVar216 + auVar137._4_4_;
      auVar138._8_4_ = fVar225 + auVar137._8_4_;
      auVar138._12_4_ = fVar226 + auVar137._12_4_;
      auVar58 = vmulps_avx512vl(auVar59,auVar61);
      local_580 = vaddps_avx512vl(local_540,auVar58);
      auVar57 = vmulps_avx512vl(auVar57,auVar61);
      local_590 = vsubps_avx512vl(local_560,auVar57);
      auVar57 = vmulps_avx512vl(auVar129,auVar61);
      _local_5a0 = vaddps_avx512vl(_local_550,auVar57);
      auVar57 = vmulps_avx512vl(auVar138,auVar61);
      _local_5b0 = vsubps_avx512vl(_local_570,auVar57);
      local_4c0 = vsubps_avx(local_540,auVar69);
      uVar127 = local_4c0._0_4_;
      auVar139._4_4_ = uVar127;
      auVar139._0_4_ = uVar127;
      auVar139._8_4_ = uVar127;
      auVar139._12_4_ = uVar127;
      auVar57 = vshufps_avx(local_4c0,local_4c0,0x55);
      auVar58 = vshufps_avx(local_4c0,local_4c0,0xaa);
      aVar1 = pre->ray_space[k].vx.field_0;
      aVar2 = pre->ray_space[k].vy.field_0;
      fVar227 = pre->ray_space[k].vz.field_0.m128[0];
      fVar216 = pre->ray_space[k].vz.field_0.m128[1];
      fVar225 = pre->ray_space[k].vz.field_0.m128[2];
      fVar226 = pre->ray_space[k].vz.field_0.m128[3];
      auVar130._0_4_ = fVar227 * auVar58._0_4_;
      auVar130._4_4_ = fVar216 * auVar58._4_4_;
      auVar130._8_4_ = fVar225 * auVar58._8_4_;
      auVar130._12_4_ = fVar226 * auVar58._12_4_;
      auVar57 = vfmadd231ps_fma(auVar130,(undefined1  [16])aVar2,auVar57);
      auVar65 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar1,auVar139);
      local_4d0 = vsubps_avx512vl(local_580,auVar69);
      uVar127 = local_4d0._0_4_;
      auVar145._4_4_ = uVar127;
      auVar145._0_4_ = uVar127;
      auVar145._8_4_ = uVar127;
      auVar145._12_4_ = uVar127;
      auVar57 = vshufps_avx(local_4d0,local_4d0,0x55);
      auVar58 = vshufps_avx(local_4d0,local_4d0,0xaa);
      auVar140._0_4_ = fVar227 * auVar58._0_4_;
      auVar140._4_4_ = fVar216 * auVar58._4_4_;
      auVar140._8_4_ = fVar225 * auVar58._8_4_;
      auVar140._12_4_ = fVar226 * auVar58._12_4_;
      auVar57 = vfmadd231ps_fma(auVar140,(undefined1  [16])aVar2,auVar57);
      auVar71 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar1,auVar145);
      local_4e0 = vsubps_avx512vl(local_590,auVar69);
      uVar127 = local_4e0._0_4_;
      auVar172._4_4_ = uVar127;
      auVar172._0_4_ = uVar127;
      auVar172._8_4_ = uVar127;
      auVar172._12_4_ = uVar127;
      auVar57 = vshufps_avx(local_4e0,local_4e0,0x55);
      auVar58 = vshufps_avx(local_4e0,local_4e0,0xaa);
      auVar146._0_4_ = fVar227 * auVar58._0_4_;
      auVar146._4_4_ = fVar216 * auVar58._4_4_;
      auVar146._8_4_ = fVar225 * auVar58._8_4_;
      auVar146._12_4_ = fVar226 * auVar58._12_4_;
      auVar57 = vfmadd231ps_fma(auVar146,(undefined1  [16])aVar2,auVar57);
      auVar70 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar1,auVar172);
      local_4f0 = vsubps_avx(local_560,auVar69);
      uVar127 = local_4f0._0_4_;
      auVar188._4_4_ = uVar127;
      auVar188._0_4_ = uVar127;
      auVar188._8_4_ = uVar127;
      auVar188._12_4_ = uVar127;
      auVar57 = vshufps_avx(local_4f0,local_4f0,0x55);
      auVar58 = vshufps_avx(local_4f0,local_4f0,0xaa);
      auVar173._0_4_ = fVar227 * auVar58._0_4_;
      auVar173._4_4_ = fVar216 * auVar58._4_4_;
      auVar173._8_4_ = fVar225 * auVar58._8_4_;
      auVar173._12_4_ = fVar226 * auVar58._12_4_;
      auVar57 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar2,auVar57);
      auVar62 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar1,auVar188);
      local_500 = vsubps_avx(_local_550,auVar69);
      uVar127 = local_500._0_4_;
      auVar189._4_4_ = uVar127;
      auVar189._0_4_ = uVar127;
      auVar189._8_4_ = uVar127;
      auVar189._12_4_ = uVar127;
      auVar57 = vshufps_avx(local_500,local_500,0x55);
      auVar58 = vshufps_avx(local_500,local_500,0xaa);
      auVar212._0_4_ = auVar58._0_4_ * fVar227;
      auVar212._4_4_ = auVar58._4_4_ * fVar216;
      auVar212._8_4_ = auVar58._8_4_ * fVar225;
      auVar212._12_4_ = auVar58._12_4_ * fVar226;
      auVar57 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar2,auVar57);
      auVar61 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar1,auVar189);
      local_510 = vsubps_avx512vl(_local_5a0,auVar69);
      uVar127 = local_510._0_4_;
      auVar190._4_4_ = uVar127;
      auVar190._0_4_ = uVar127;
      auVar190._8_4_ = uVar127;
      auVar190._12_4_ = uVar127;
      auVar57 = vshufps_avx(local_510,local_510,0x55);
      auVar58 = vshufps_avx(local_510,local_510,0xaa);
      auVar217._0_4_ = auVar58._0_4_ * fVar227;
      auVar217._4_4_ = auVar58._4_4_ * fVar216;
      auVar217._8_4_ = auVar58._8_4_ * fVar225;
      auVar217._12_4_ = auVar58._12_4_ * fVar226;
      auVar57 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar2,auVar57);
      auVar60 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar1,auVar190);
      local_520 = vsubps_avx512vl(_local_5b0,auVar69);
      uVar127 = local_520._0_4_;
      auVar191._4_4_ = uVar127;
      auVar191._0_4_ = uVar127;
      auVar191._8_4_ = uVar127;
      auVar191._12_4_ = uVar127;
      auVar57 = vshufps_avx(local_520,local_520,0x55);
      auVar58 = vshufps_avx(local_520,local_520,0xaa);
      auVar230._0_4_ = auVar58._0_4_ * fVar227;
      auVar230._4_4_ = auVar58._4_4_ * fVar216;
      auVar230._8_4_ = auVar58._8_4_ * fVar225;
      auVar230._12_4_ = auVar58._12_4_ * fVar226;
      auVar57 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar2,auVar57);
      auVar63 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar1,auVar191);
      local_530 = vsubps_avx512vl(_local_570,auVar69);
      uVar127 = local_530._0_4_;
      auVar119._4_4_ = uVar127;
      auVar119._0_4_ = uVar127;
      auVar119._8_4_ = uVar127;
      auVar119._12_4_ = uVar127;
      auVar57 = vshufps_avx(local_530,local_530,0x55);
      auVar58 = vshufps_avx(local_530,local_530,0xaa);
      auVar182._0_4_ = auVar58._0_4_ * fVar227;
      auVar182._4_4_ = auVar58._4_4_ * fVar216;
      auVar182._8_4_ = auVar58._8_4_ * fVar225;
      auVar182._12_4_ = auVar58._12_4_ * fVar226;
      auVar57 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar2,auVar57);
      auVar64 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar1,auVar119);
      auVar59 = vmovlhps_avx(auVar65,auVar61);
      auVar68 = vmovlhps_avx(auVar71,auVar60);
      local_620 = vmovlhps_avx512f(auVar70,auVar63);
      _local_480 = vmovlhps_avx512f(auVar62,auVar64);
      auVar58 = vminps_avx(auVar59,auVar68);
      auVar57 = vmaxps_avx(auVar59,auVar68);
      auVar69 = vminps_avx512vl(local_620,_local_480);
      auVar58 = vminps_avx(auVar58,auVar69);
      auVar69 = vmaxps_avx512vl(local_620,_local_480);
      auVar57 = vmaxps_avx(auVar57,auVar69);
      auVar69 = vshufpd_avx(auVar58,auVar58,3);
      auVar58 = vminps_avx(auVar58,auVar69);
      auVar69 = vshufpd_avx(auVar57,auVar57,3);
      auVar57 = vmaxps_avx(auVar57,auVar69);
      auVar58 = vandps_avx512vl(auVar58,auVar264._0_16_);
      auVar57 = vandps_avx512vl(auVar57,auVar264._0_16_);
      auVar57 = vmaxps_avx(auVar58,auVar57);
      auVar58 = vmovshdup_avx(auVar57);
      auVar57 = vmaxss_avx(auVar58,auVar57);
      local_678 = (uint)uVar56 + 0xf;
      fVar227 = auVar57._0_4_ * 9.536743e-07;
      local_630 = vmovddup_avx512vl(auVar65);
      auVar266 = ZEXT1664(local_630);
      local_640 = vmovddup_avx512vl(auVar71);
      auVar268 = ZEXT1664(local_640);
      auVar58 = vmovddup_avx512vl(auVar70);
      auVar69 = vmovddup_avx512vl(auVar62);
      local_470 = ZEXT416((uint)fVar227);
      auVar120._4_4_ = fVar227;
      auVar120._0_4_ = fVar227;
      auVar120._8_4_ = fVar227;
      auVar120._12_4_ = fVar227;
      local_3c0._16_4_ = fVar227;
      local_3c0._0_16_ = auVar120;
      local_3c0._20_4_ = fVar227;
      local_3c0._24_4_ = fVar227;
      local_3c0._28_4_ = fVar227;
      auVar57 = vxorps_avx512vl(auVar120,auVar260._0_16_);
      local_3e0 = auVar57._0_4_;
      uStack_3dc = local_3e0;
      uStack_3d8 = local_3e0;
      uStack_3d4 = local_3e0;
      uStack_3d0 = local_3e0;
      uStack_3cc = local_3e0;
      uStack_3c8 = local_3e0;
      uStack_3c4 = local_3e0;
      uVar45 = 0;
      local_490 = vsubps_avx(auVar68,auVar59);
      local_4a0 = vsubps_avx512vl(local_620,auVar68);
      local_4b0 = vsubps_avx512vl(_local_480,local_620);
      local_5c0 = vsubps_avx(_local_550,local_540);
      local_5d0 = vsubps_avx512vl(_local_5a0,local_580);
      local_5e0 = vsubps_avx512vl(_local_5b0,local_590);
      _local_5f0 = vsubps_avx512vl(_local_570,local_560);
      auVar125 = vpbroadcastd_avx512f();
      local_300 = vmovdqa64_avx512f(auVar125);
      auVar125 = vpbroadcastd_avx512f();
      local_340 = vmovdqa64_avx512f(auVar125);
      auVar57 = ZEXT816(0x3f80000000000000);
      auVar116._16_48_ = auVar125._16_48_;
      auVar131 = auVar57;
LAB_01ab2c1f:
      auVar65 = vshufps_avx(auVar131,auVar131,0x50);
      auVar251._8_4_ = 0x3f800000;
      auVar251._0_8_ = 0x3f8000003f800000;
      auVar251._12_4_ = 0x3f800000;
      auVar104._16_4_ = 0x3f800000;
      auVar104._0_16_ = auVar251;
      auVar104._20_4_ = 0x3f800000;
      auVar104._24_4_ = 0x3f800000;
      auVar104._28_4_ = 0x3f800000;
      auVar71 = vsubps_avx(auVar251,auVar65);
      fVar227 = auVar65._0_4_;
      fVar152 = auVar61._0_4_;
      auVar154._0_4_ = fVar152 * fVar227;
      fVar216 = auVar65._4_4_;
      fVar158 = auVar61._4_4_;
      auVar154._4_4_ = fVar158 * fVar216;
      fVar225 = auVar65._8_4_;
      auVar154._8_4_ = fVar152 * fVar225;
      fVar226 = auVar65._12_4_;
      auVar154._12_4_ = fVar158 * fVar226;
      fVar159 = auVar60._0_4_;
      auVar161._0_4_ = fVar159 * fVar227;
      fVar168 = auVar60._4_4_;
      auVar161._4_4_ = fVar168 * fVar216;
      auVar161._8_4_ = fVar159 * fVar225;
      auVar161._12_4_ = fVar168 * fVar226;
      fVar126 = auVar63._0_4_;
      auVar174._0_4_ = fVar126 * fVar227;
      fVar133 = auVar63._4_4_;
      auVar174._4_4_ = fVar133 * fVar216;
      auVar174._8_4_ = fVar126 * fVar225;
      auVar174._12_4_ = fVar133 * fVar226;
      fVar134 = auVar64._0_4_;
      auVar141._0_4_ = fVar134 * fVar227;
      fVar135 = auVar64._4_4_;
      auVar141._4_4_ = fVar135 * fVar216;
      auVar141._8_4_ = fVar134 * fVar225;
      auVar141._12_4_ = fVar135 * fVar226;
      auVar70 = vfmadd231ps_avx512vl(auVar154,auVar71,auVar266._0_16_);
      auVar62 = vfmadd231ps_avx512vl(auVar161,auVar71,auVar268._0_16_);
      auVar66 = vfmadd231ps_avx512vl(auVar174,auVar71,auVar58);
      auVar71 = vfmadd231ps_avx512vl(auVar141,auVar69,auVar71);
      auVar65 = vmovshdup_avx(auVar57);
      fVar216 = auVar57._0_4_;
      fVar227 = (auVar65._0_4_ - fVar216) * 0.04761905;
      auVar98._4_4_ = fVar216;
      auVar98._0_4_ = fVar216;
      auVar98._8_4_ = fVar216;
      auVar98._12_4_ = fVar216;
      auVar98._16_4_ = fVar216;
      auVar98._20_4_ = fVar216;
      auVar98._24_4_ = fVar216;
      auVar98._28_4_ = fVar216;
      auVar88._0_8_ = auVar65._0_8_;
      auVar88._8_8_ = auVar88._0_8_;
      auVar88._16_8_ = auVar88._0_8_;
      auVar88._24_8_ = auVar88._0_8_;
      auVar101 = vsubps_avx(auVar88,auVar98);
      uVar127 = auVar70._0_4_;
      auVar102._4_4_ = uVar127;
      auVar102._0_4_ = uVar127;
      auVar102._8_4_ = uVar127;
      auVar102._12_4_ = uVar127;
      auVar102._16_4_ = uVar127;
      auVar102._20_4_ = uVar127;
      auVar102._24_4_ = uVar127;
      auVar102._28_4_ = uVar127;
      auVar90._8_4_ = 1;
      auVar90._0_8_ = 0x100000001;
      auVar90._12_4_ = 1;
      auVar90._16_4_ = 1;
      auVar90._20_4_ = 1;
      auVar90._24_4_ = 1;
      auVar90._28_4_ = 1;
      auVar100 = ZEXT1632(auVar70);
      auVar99 = vpermps_avx2(auVar90,auVar100);
      auVar115._32_32_ = auVar116._32_32_;
      auVar84 = vbroadcastss_avx512vl(auVar62);
      auVar94 = ZEXT1632(auVar62);
      auVar85 = vpermps_avx512vl(auVar90,auVar94);
      auVar86 = vbroadcastss_avx512vl(auVar66);
      auVar95 = ZEXT1632(auVar66);
      auVar87 = vpermps_avx512vl(auVar90,auVar95);
      auVar88 = vbroadcastss_avx512vl(auVar71);
      auVar97 = ZEXT1632(auVar71);
      auVar89 = vpermps_avx512vl(auVar90,auVar97);
      auVar103._4_4_ = fVar227;
      auVar103._0_4_ = fVar227;
      auVar103._8_4_ = fVar227;
      auVar103._12_4_ = fVar227;
      auVar103._16_4_ = fVar227;
      auVar103._20_4_ = fVar227;
      auVar103._24_4_ = fVar227;
      auVar103._28_4_ = fVar227;
      auVar96._8_4_ = 2;
      auVar96._0_8_ = 0x200000002;
      auVar96._12_4_ = 2;
      auVar96._16_4_ = 2;
      auVar96._20_4_ = 2;
      auVar96._24_4_ = 2;
      auVar96._28_4_ = 2;
      auVar90 = vpermps_avx512vl(auVar96,auVar100);
      auVar91 = vbroadcastss_avx512vl(ZEXT416(3));
      auVar92 = vpermps_avx512vl(auVar91,auVar100);
      auVar93 = vpermps_avx512vl(auVar96,auVar94);
      auVar94 = vpermps_avx512vl(auVar91,auVar94);
      auVar100 = vpermps_avx2(auVar96,auVar95);
      auVar95 = vpermps_avx512vl(auVar91,auVar95);
      auVar96 = vpermps_avx512vl(auVar96,auVar97);
      auVar91 = vpermps_avx512vl(auVar91,auVar97);
      auVar65 = vfmadd132ps_fma(auVar101,auVar98,_DAT_01faff20);
      auVar101 = vsubps_avx(auVar104,ZEXT1632(auVar65));
      auVar97 = vmulps_avx512vl(auVar84,ZEXT1632(auVar65));
      auVar104 = ZEXT1632(auVar65);
      auVar98 = vmulps_avx512vl(auVar85,auVar104);
      auVar71 = vfmadd231ps_fma(auVar97,auVar101,auVar102);
      auVar70 = vfmadd231ps_fma(auVar98,auVar101,auVar99);
      auVar97 = vmulps_avx512vl(auVar86,auVar104);
      auVar98 = vmulps_avx512vl(auVar87,auVar104);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar101,auVar84);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,auVar85);
      auVar84 = vmulps_avx512vl(auVar88,auVar104);
      auVar102 = ZEXT1632(auVar65);
      auVar85 = vmulps_avx512vl(auVar89,auVar102);
      auVar86 = vfmadd231ps_avx512vl(auVar84,auVar101,auVar86);
      auVar87 = vfmadd231ps_avx512vl(auVar85,auVar101,auVar87);
      fVar225 = auVar65._0_4_;
      fVar226 = auVar65._4_4_;
      auVar84._4_4_ = fVar226 * auVar97._4_4_;
      auVar84._0_4_ = fVar225 * auVar97._0_4_;
      fVar228 = auVar65._8_4_;
      auVar84._8_4_ = fVar228 * auVar97._8_4_;
      fVar239 = auVar65._12_4_;
      auVar84._12_4_ = fVar239 * auVar97._12_4_;
      auVar84._16_4_ = auVar97._16_4_ * 0.0;
      auVar84._20_4_ = auVar97._20_4_ * 0.0;
      auVar84._24_4_ = auVar97._24_4_ * 0.0;
      auVar84._28_4_ = fVar216;
      auVar85._4_4_ = fVar226 * auVar98._4_4_;
      auVar85._0_4_ = fVar225 * auVar98._0_4_;
      auVar85._8_4_ = fVar228 * auVar98._8_4_;
      auVar85._12_4_ = fVar239 * auVar98._12_4_;
      auVar85._16_4_ = auVar98._16_4_ * 0.0;
      auVar85._20_4_ = auVar98._20_4_ * 0.0;
      auVar85._24_4_ = auVar98._24_4_ * 0.0;
      auVar85._28_4_ = auVar99._28_4_;
      auVar71 = vfmadd231ps_fma(auVar84,auVar101,ZEXT1632(auVar71));
      auVar70 = vfmadd231ps_fma(auVar85,auVar101,ZEXT1632(auVar70));
      auVar89._0_4_ = fVar225 * auVar86._0_4_;
      auVar89._4_4_ = fVar226 * auVar86._4_4_;
      auVar89._8_4_ = fVar228 * auVar86._8_4_;
      auVar89._12_4_ = fVar239 * auVar86._12_4_;
      auVar89._16_4_ = auVar86._16_4_ * 0.0;
      auVar89._20_4_ = auVar86._20_4_ * 0.0;
      auVar89._24_4_ = auVar86._24_4_ * 0.0;
      auVar89._28_4_ = 0;
      auVar99._4_4_ = fVar226 * auVar87._4_4_;
      auVar99._0_4_ = fVar225 * auVar87._0_4_;
      auVar99._8_4_ = fVar228 * auVar87._8_4_;
      auVar99._12_4_ = fVar239 * auVar87._12_4_;
      auVar99._16_4_ = auVar87._16_4_ * 0.0;
      auVar99._20_4_ = auVar87._20_4_ * 0.0;
      auVar99._24_4_ = auVar87._24_4_ * 0.0;
      auVar99._28_4_ = auVar86._28_4_;
      auVar62 = vfmadd231ps_fma(auVar89,auVar101,auVar97);
      auVar66 = vfmadd231ps_fma(auVar99,auVar101,auVar98);
      auVar86._28_4_ = auVar98._28_4_;
      auVar86._0_28_ =
           ZEXT1628(CONCAT412(fVar239 * auVar66._12_4_,
                              CONCAT48(fVar228 * auVar66._8_4_,
                                       CONCAT44(fVar226 * auVar66._4_4_,fVar225 * auVar66._0_4_))));
      auVar67 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar239 * auVar62._12_4_,
                                                   CONCAT48(fVar228 * auVar62._8_4_,
                                                            CONCAT44(fVar226 * auVar62._4_4_,
                                                                     fVar225 * auVar62._0_4_)))),
                                auVar101,ZEXT1632(auVar71));
      auVar72 = vfmadd231ps_fma(auVar86,auVar101,ZEXT1632(auVar70));
      auVar99 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar71));
      auVar84 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar70));
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar99 = vmulps_avx512vl(auVar99,auVar85);
      auVar84 = vmulps_avx512vl(auVar84,auVar85);
      auVar97._0_4_ = fVar227 * auVar99._0_4_;
      auVar97._4_4_ = fVar227 * auVar99._4_4_;
      auVar97._8_4_ = fVar227 * auVar99._8_4_;
      auVar97._12_4_ = fVar227 * auVar99._12_4_;
      auVar97._16_4_ = fVar227 * auVar99._16_4_;
      auVar97._20_4_ = fVar227 * auVar99._20_4_;
      auVar97._24_4_ = fVar227 * auVar99._24_4_;
      auVar97._28_4_ = 0;
      auVar99 = vmulps_avx512vl(auVar103,auVar84);
      auVar70 = vxorps_avx512vl(auVar88._0_16_,auVar88._0_16_);
      auVar84 = vpermt2ps_avx512vl(ZEXT1632(auVar67),_DAT_01feed00,ZEXT1632(auVar70));
      auVar86 = vpermt2ps_avx512vl(ZEXT1632(auVar72),_DAT_01feed00,ZEXT1632(auVar70));
      auVar144._0_4_ = auVar97._0_4_ + auVar67._0_4_;
      auVar144._4_4_ = auVar97._4_4_ + auVar67._4_4_;
      auVar144._8_4_ = auVar97._8_4_ + auVar67._8_4_;
      auVar144._12_4_ = auVar97._12_4_ + auVar67._12_4_;
      auVar144._16_4_ = auVar97._16_4_ + 0.0;
      auVar144._20_4_ = auVar97._20_4_ + 0.0;
      auVar144._24_4_ = auVar97._24_4_ + 0.0;
      auVar144._28_4_ = 0;
      auVar98 = ZEXT1632(auVar70);
      auVar87 = vpermt2ps_avx512vl(auVar97,_DAT_01feed00,auVar98);
      auVar88 = vaddps_avx512vl(ZEXT1632(auVar72),auVar99);
      auVar89 = vpermt2ps_avx512vl(auVar99,_DAT_01feed00,auVar98);
      auVar99 = vsubps_avx(auVar84,auVar87);
      auVar89 = vsubps_avx512vl(auVar86,auVar89);
      auVar87 = vmulps_avx512vl(auVar93,auVar102);
      auVar97 = vmulps_avx512vl(auVar94,auVar102);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar101,auVar90);
      auVar90 = vfmadd231ps_avx512vl(auVar97,auVar101,auVar92);
      auVar92 = vmulps_avx512vl(auVar100,auVar102);
      auVar97 = vmulps_avx512vl(auVar95,auVar102);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar101,auVar93);
      auVar93 = vfmadd231ps_avx512vl(auVar97,auVar101,auVar94);
      auVar94 = vmulps_avx512vl(auVar96,auVar102);
      auVar91 = vmulps_avx512vl(auVar91,auVar102);
      auVar71 = vfmadd231ps_fma(auVar94,auVar101,auVar100);
      auVar100 = vfmadd231ps_avx512vl(auVar91,auVar101,auVar95);
      auVar91 = vmulps_avx512vl(auVar102,auVar92);
      auVar96 = ZEXT1632(auVar65);
      auVar94 = vmulps_avx512vl(auVar96,auVar93);
      auVar87 = vfmadd231ps_avx512vl(auVar91,auVar101,auVar87);
      auVar90 = vfmadd231ps_avx512vl(auVar94,auVar101,auVar90);
      auVar100 = vmulps_avx512vl(auVar96,auVar100);
      auVar91 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar239 * auVar71._12_4_,
                                              CONCAT48(fVar228 * auVar71._8_4_,
                                                       CONCAT44(fVar226 * auVar71._4_4_,
                                                                fVar225 * auVar71._0_4_)))),auVar101
                           ,auVar92);
      auVar92 = vfmadd231ps_avx512vl(auVar100,auVar101,auVar93);
      auVar100._4_4_ = fVar226 * auVar91._4_4_;
      auVar100._0_4_ = fVar225 * auVar91._0_4_;
      auVar100._8_4_ = fVar228 * auVar91._8_4_;
      auVar100._12_4_ = fVar239 * auVar91._12_4_;
      auVar100._16_4_ = auVar91._16_4_ * 0.0;
      auVar100._20_4_ = auVar91._20_4_ * 0.0;
      auVar100._24_4_ = auVar91._24_4_ * 0.0;
      auVar100._28_4_ = auVar95._28_4_;
      auVar93 = vmulps_avx512vl(auVar96,auVar92);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar101,auVar87);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar90,auVar101);
      auVar101 = vsubps_avx512vl(auVar91,auVar87);
      auVar87 = vsubps_avx512vl(auVar92,auVar90);
      auVar90 = vmulps_avx512vl(auVar101,auVar85);
      auVar85 = vmulps_avx512vl(auVar87,auVar85);
      fVar216 = fVar227 * auVar90._0_4_;
      fVar225 = fVar227 * auVar90._4_4_;
      auVar101._4_4_ = fVar225;
      auVar101._0_4_ = fVar216;
      fVar226 = fVar227 * auVar90._8_4_;
      auVar101._8_4_ = fVar226;
      fVar228 = fVar227 * auVar90._12_4_;
      auVar101._12_4_ = fVar228;
      fVar239 = fVar227 * auVar90._16_4_;
      auVar101._16_4_ = fVar239;
      fVar240 = fVar227 * auVar90._20_4_;
      auVar101._20_4_ = fVar240;
      fVar227 = fVar227 * auVar90._24_4_;
      auVar101._24_4_ = fVar227;
      auVar101._28_4_ = auVar90._28_4_;
      auVar85 = vmulps_avx512vl(auVar103,auVar85);
      auVar91 = vpermt2ps_avx512vl(auVar100,_DAT_01feed00,auVar98);
      auVar92 = vpermt2ps_avx512vl(auVar93,_DAT_01feed00,auVar98);
      auVar215._0_4_ = auVar100._0_4_ + fVar216;
      auVar215._4_4_ = auVar100._4_4_ + fVar225;
      auVar215._8_4_ = auVar100._8_4_ + fVar226;
      auVar215._12_4_ = auVar100._12_4_ + fVar228;
      auVar215._16_4_ = auVar100._16_4_ + fVar239;
      auVar215._20_4_ = auVar100._20_4_ + fVar240;
      auVar215._24_4_ = auVar100._24_4_ + fVar227;
      auVar215._28_4_ = auVar100._28_4_ + auVar90._28_4_;
      auVar101 = vpermt2ps_avx512vl(auVar101,_DAT_01feed00,ZEXT1632(auVar70));
      auVar90 = vaddps_avx512vl(auVar93,auVar85);
      auVar85 = vpermt2ps_avx512vl(auVar85,_DAT_01feed00,ZEXT1632(auVar70));
      auVar101 = vsubps_avx(auVar91,auVar101);
      auVar85 = vsubps_avx512vl(auVar92,auVar85);
      auVar157 = ZEXT1632(auVar67);
      auVar87 = vsubps_avx512vl(auVar100,auVar157);
      auVar167 = ZEXT1632(auVar72);
      auVar94 = vsubps_avx512vl(auVar93,auVar167);
      auVar95 = vsubps_avx512vl(auVar91,auVar84);
      auVar87 = vaddps_avx512vl(auVar87,auVar95);
      auVar95 = vsubps_avx512vl(auVar92,auVar86);
      auVar94 = vaddps_avx512vl(auVar94,auVar95);
      auVar95 = vmulps_avx512vl(auVar167,auVar87);
      auVar95 = vfnmadd231ps_avx512vl(auVar95,auVar157,auVar94);
      auVar96 = vmulps_avx512vl(auVar88,auVar87);
      auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar144,auVar94);
      auVar97 = vmulps_avx512vl(auVar89,auVar87);
      auVar97 = vfnmadd231ps_avx512vl(auVar97,auVar99,auVar94);
      auVar98 = vmulps_avx512vl(auVar86,auVar87);
      auVar98 = vfnmadd231ps_avx512vl(auVar98,auVar84,auVar94);
      auVar102 = vmulps_avx512vl(auVar93,auVar87);
      auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar100,auVar94);
      auVar103 = vmulps_avx512vl(auVar90,auVar87);
      auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar215,auVar94);
      auVar104 = vmulps_avx512vl(auVar85,auVar87);
      auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar101,auVar94);
      auVar87 = vmulps_avx512vl(auVar92,auVar87);
      auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar91,auVar94);
      auVar94 = vminps_avx512vl(auVar95,auVar96);
      auVar95 = vmaxps_avx512vl(auVar95,auVar96);
      auVar96 = vminps_avx512vl(auVar97,auVar98);
      auVar94 = vminps_avx512vl(auVar94,auVar96);
      auVar96 = vmaxps_avx512vl(auVar97,auVar98);
      auVar95 = vmaxps_avx512vl(auVar95,auVar96);
      auVar96 = vminps_avx512vl(auVar102,auVar103);
      auVar97 = vmaxps_avx512vl(auVar102,auVar103);
      auVar98 = vminps_avx512vl(auVar104,auVar87);
      auVar96 = vminps_avx512vl(auVar96,auVar98);
      auVar94 = vminps_avx512vl(auVar94,auVar96);
      auVar87 = vmaxps_avx512vl(auVar104,auVar87);
      auVar87 = vmaxps_avx512vl(auVar97,auVar87);
      auVar95 = vmaxps_avx512vl(auVar95,auVar87);
      uVar21 = vcmpps_avx512vl(auVar94,local_3c0,2);
      auVar87._4_4_ = uStack_3dc;
      auVar87._0_4_ = local_3e0;
      auVar87._8_4_ = uStack_3d8;
      auVar87._12_4_ = uStack_3d4;
      auVar87._16_4_ = uStack_3d0;
      auVar87._20_4_ = uStack_3cc;
      auVar87._24_4_ = uStack_3c8;
      auVar87._28_4_ = uStack_3c4;
      uVar22 = vcmpps_avx512vl(auVar95,auVar87,5);
      bVar43 = (byte)uVar21 & (byte)uVar22 & 0x7f;
      if (bVar43 != 0) {
        auVar94 = vsubps_avx512vl(auVar84,auVar157);
        auVar95 = vsubps_avx512vl(auVar86,auVar167);
        auVar96 = vsubps_avx512vl(auVar91,auVar100);
        auVar94 = vaddps_avx512vl(auVar94,auVar96);
        auVar96 = vsubps_avx512vl(auVar92,auVar93);
        auVar95 = vaddps_avx512vl(auVar95,auVar96);
        auVar96 = vmulps_avx512vl(auVar167,auVar94);
        auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar95,auVar157);
        auVar88 = vmulps_avx512vl(auVar88,auVar94);
        auVar88 = vfnmadd213ps_avx512vl(auVar144,auVar95,auVar88);
        auVar89 = vmulps_avx512vl(auVar89,auVar94);
        auVar89 = vfnmadd213ps_avx512vl(auVar99,auVar95,auVar89);
        auVar99 = vmulps_avx512vl(auVar86,auVar94);
        auVar86 = vfnmadd231ps_avx512vl(auVar99,auVar95,auVar84);
        auVar99 = vmulps_avx512vl(auVar93,auVar94);
        auVar93 = vfnmadd231ps_avx512vl(auVar99,auVar95,auVar100);
        auVar99 = vmulps_avx512vl(auVar90,auVar94);
        auVar90 = vfnmadd213ps_avx512vl(auVar215,auVar95,auVar99);
        auVar99 = vmulps_avx512vl(auVar85,auVar94);
        auVar97 = vfnmadd213ps_avx512vl(auVar101,auVar95,auVar99);
        auVar101 = vmulps_avx512vl(auVar92,auVar94);
        auVar91 = vfnmadd231ps_avx512vl(auVar101,auVar91,auVar95);
        auVar99 = vminps_avx(auVar96,auVar88);
        auVar101 = vmaxps_avx(auVar96,auVar88);
        auVar84 = vminps_avx(auVar89,auVar86);
        auVar84 = vminps_avx(auVar99,auVar84);
        auVar99 = vmaxps_avx(auVar89,auVar86);
        auVar101 = vmaxps_avx(auVar101,auVar99);
        auVar100 = vminps_avx(auVar93,auVar90);
        auVar99 = vmaxps_avx(auVar93,auVar90);
        auVar85 = vminps_avx(auVar97,auVar91);
        auVar100 = vminps_avx(auVar100,auVar85);
        auVar100 = vminps_avx(auVar84,auVar100);
        auVar84 = vmaxps_avx(auVar97,auVar91);
        auVar99 = vmaxps_avx(auVar99,auVar84);
        auVar101 = vmaxps_avx(auVar101,auVar99);
        uVar21 = vcmpps_avx512vl(auVar101,auVar87,5);
        uVar22 = vcmpps_avx512vl(auVar100,local_3c0,2);
        bVar43 = bVar43 & (byte)uVar21 & (byte)uVar22;
        if (bVar43 != 0) {
          auStack_610[uVar45] = (uint)bVar43;
          uVar21 = vmovlps_avx(auVar57);
          (&uStack_460)[uVar45] = uVar21;
          uVar49 = vmovlps_avx(auVar131);
          auStack_3a0[uVar45] = uVar49;
          uVar45 = (ulong)((int)uVar45 + 1);
        }
      }
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar125 = ZEXT1664(auVar57);
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar260 = ZEXT1664(auVar57);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar261 = ZEXT3264(auVar101);
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar262 = ZEXT1664(auVar57);
      auVar115._0_32_ = _DAT_01feed20;
      auVar263 = ZEXT3264(_DAT_01feed20);
      if ((int)uVar45 != 0) {
        do {
          auVar71 = auVar268._0_16_;
          auVar65 = auVar266._0_16_;
          uVar44 = (int)uVar45 - 1;
          uVar46 = (ulong)uVar44;
          uVar5 = auStack_610[uVar46];
          auVar131._8_8_ = 0;
          auVar131._0_8_ = auStack_3a0[uVar46];
          uVar49 = 0;
          for (uVar50 = (ulong)uVar5; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000)
          {
            uVar49 = uVar49 + 1;
          }
          uVar48 = uVar5 - 1 & uVar5;
          bVar54 = uVar48 == 0;
          auStack_610[uVar46] = uVar48;
          if (bVar54) {
            uVar45 = (ulong)uVar44;
          }
          auVar121._8_8_ = 0;
          auVar121._0_8_ = uVar49;
          auVar57 = vpunpcklqdq_avx(auVar121,ZEXT416((int)uVar49 + 1));
          auVar116._16_48_ = auVar115._16_48_;
          auVar57 = vcvtqq2ps_avx512vl(auVar57);
          auVar57 = vmulps_avx512vl(auVar57,auVar262._0_16_);
          uVar127 = *(undefined4 *)((long)&uStack_460 + uVar46 * 8 + 4);
          auVar23._4_4_ = uVar127;
          auVar23._0_4_ = uVar127;
          auVar23._8_4_ = uVar127;
          auVar23._12_4_ = uVar127;
          auVar70 = vmulps_avx512vl(auVar57,auVar23);
          auVar62 = auVar265._0_16_;
          auVar57 = vsubps_avx512vl(auVar62,auVar57);
          uVar127 = *(undefined4 *)(&uStack_460 + uVar46);
          auVar24._4_4_ = uVar127;
          auVar24._0_4_ = uVar127;
          auVar24._8_4_ = uVar127;
          auVar24._12_4_ = uVar127;
          auVar57 = vfmadd231ps_avx512vl(auVar70,auVar57,auVar24);
          auVar70 = vmovshdup_avx(auVar57);
          fVar227 = auVar70._0_4_ - auVar57._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar227));
          if (uVar5 == 0 || bVar54) goto LAB_01ab2c1f;
          auVar70 = vshufps_avx(auVar131,auVar131,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar227));
          uVar44 = (uint)uVar45;
          auVar66 = vsubps_avx512vl(auVar62,auVar70);
          fVar216 = auVar70._0_4_;
          auVar162._0_4_ = fVar216 * fVar152;
          fVar225 = auVar70._4_4_;
          auVar162._4_4_ = fVar225 * fVar158;
          fVar226 = auVar70._8_4_;
          auVar162._8_4_ = fVar226 * fVar152;
          fVar228 = auVar70._12_4_;
          auVar162._12_4_ = fVar228 * fVar158;
          auVar175._0_4_ = fVar216 * fVar159;
          auVar175._4_4_ = fVar225 * fVar168;
          auVar175._8_4_ = fVar226 * fVar159;
          auVar175._12_4_ = fVar228 * fVar168;
          auVar183._0_4_ = fVar216 * fVar126;
          auVar183._4_4_ = fVar225 * fVar133;
          auVar183._8_4_ = fVar226 * fVar126;
          auVar183._12_4_ = fVar228 * fVar133;
          auVar147._0_4_ = fVar216 * fVar134;
          auVar147._4_4_ = fVar225 * fVar135;
          auVar147._8_4_ = fVar226 * fVar134;
          auVar147._12_4_ = fVar228 * fVar135;
          auVar67 = vfmadd231ps_avx512vl(auVar162,auVar66,auVar65);
          auVar72 = vfmadd231ps_avx512vl(auVar175,auVar66,auVar71);
          auVar70 = vfmadd231ps_fma(auVar183,auVar66,auVar58);
          auVar66 = vfmadd231ps_fma(auVar147,auVar66,auVar69);
          auVar91._16_16_ = auVar67;
          auVar91._0_16_ = auVar67;
          auVar92._16_16_ = auVar72;
          auVar92._0_16_ = auVar72;
          auVar94._16_16_ = auVar70;
          auVar94._0_16_ = auVar70;
          auVar266._32_32_ = auVar115._32_32_;
          auVar99 = vpermps_avx512vl(auVar263._0_32_,ZEXT1632(auVar57));
          auVar101 = vsubps_avx(auVar92,auVar91);
          auVar67 = vfmadd213ps_fma(auVar101,auVar99,auVar91);
          auVar101 = vsubps_avx(auVar94,auVar92);
          auVar72 = vfmadd213ps_fma(auVar101,auVar99,auVar92);
          auVar70 = vsubps_avx(auVar66,auVar70);
          auVar93._16_16_ = auVar70;
          auVar93._0_16_ = auVar70;
          auVar70 = vfmadd213ps_fma(auVar93,auVar99,auVar94);
          auVar101 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar67));
          auVar66 = vfmadd213ps_fma(auVar101,auVar99,ZEXT1632(auVar67));
          auVar101 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar72));
          auVar70 = vfmadd213ps_fma(auVar101,auVar99,ZEXT1632(auVar72));
          auVar101 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar66));
          auVar153 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar101,auVar99);
          auVar266._0_32_ = vmulps_avx512vl(auVar101,auVar261._0_32_);
          auVar116._16_48_ = auVar266._16_48_;
          auVar70 = vmulss_avx512f(ZEXT416((uint)fVar227),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar216 = auVar70._0_4_;
          auVar184._0_8_ =
               CONCAT44(auVar153._4_4_ + fVar216 * auVar266._4_4_,
                        auVar153._0_4_ + fVar216 * auVar266._0_4_);
          auVar184._8_4_ = auVar153._8_4_ + fVar216 * auVar266._8_4_;
          auVar184._12_4_ = auVar153._12_4_ + fVar216 * auVar266._12_4_;
          auVar163._0_4_ = fVar216 * auVar266._16_4_;
          auVar163._4_4_ = fVar216 * auVar266._20_4_;
          auVar163._8_4_ = fVar216 * auVar266._24_4_;
          auVar163._12_4_ = fVar216 * auVar266._28_4_;
          auVar78 = vsubps_avx((undefined1  [16])0x0,auVar163);
          auVar79 = vshufpd_avx(auVar153,auVar153,3);
          auVar80 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar70 = vsubps_avx(auVar79,auVar153);
          auVar66 = vsubps_avx(auVar80,(undefined1  [16])0x0);
          auVar202._0_4_ = auVar70._0_4_ + auVar66._0_4_;
          auVar202._4_4_ = auVar70._4_4_ + auVar66._4_4_;
          auVar202._8_4_ = auVar70._8_4_ + auVar66._8_4_;
          auVar202._12_4_ = auVar70._12_4_ + auVar66._12_4_;
          auVar70 = vshufps_avx(auVar153,auVar153,0xb1);
          auVar66 = vshufps_avx(auVar184,auVar184,0xb1);
          auVar67 = vshufps_avx(auVar78,auVar78,0xb1);
          auVar72 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar252._4_4_ = auVar202._0_4_;
          auVar252._0_4_ = auVar202._0_4_;
          auVar252._8_4_ = auVar202._0_4_;
          auVar252._12_4_ = auVar202._0_4_;
          auVar75 = vshufps_avx(auVar202,auVar202,0x55);
          fVar216 = auVar75._0_4_;
          auVar213._0_4_ = auVar70._0_4_ * fVar216;
          fVar225 = auVar75._4_4_;
          auVar213._4_4_ = auVar70._4_4_ * fVar225;
          fVar226 = auVar75._8_4_;
          auVar213._8_4_ = auVar70._8_4_ * fVar226;
          fVar228 = auVar75._12_4_;
          auVar213._12_4_ = auVar70._12_4_ * fVar228;
          auVar218._0_4_ = auVar66._0_4_ * fVar216;
          auVar218._4_4_ = auVar66._4_4_ * fVar225;
          auVar218._8_4_ = auVar66._8_4_ * fVar226;
          auVar218._12_4_ = auVar66._12_4_ * fVar228;
          auVar231._0_4_ = auVar67._0_4_ * fVar216;
          auVar231._4_4_ = auVar67._4_4_ * fVar225;
          auVar231._8_4_ = auVar67._8_4_ * fVar226;
          auVar231._12_4_ = auVar67._12_4_ * fVar228;
          auVar203._0_4_ = auVar72._0_4_ * fVar216;
          auVar203._4_4_ = auVar72._4_4_ * fVar225;
          auVar203._8_4_ = auVar72._8_4_ * fVar226;
          auVar203._12_4_ = auVar72._12_4_ * fVar228;
          auVar70 = vfmadd231ps_fma(auVar213,auVar252,auVar153);
          auVar66 = vfmadd231ps_fma(auVar218,auVar252,auVar184);
          auVar77 = vfmadd231ps_fma(auVar231,auVar252,auVar78);
          auVar83 = vfmadd231ps_fma(auVar203,(undefined1  [16])0x0,auVar252);
          auVar75 = vshufpd_avx(auVar70,auVar70,1);
          auVar76 = vshufpd_avx(auVar66,auVar66,1);
          auVar73 = vshufpd_avx512vl(auVar77,auVar77,1);
          auVar74 = vshufpd_avx512vl(auVar83,auVar83,1);
          auVar67 = vminss_avx(auVar70,auVar66);
          auVar70 = vmaxss_avx(auVar66,auVar70);
          auVar72 = vminss_avx(auVar77,auVar83);
          auVar66 = vmaxss_avx(auVar83,auVar77);
          auVar67 = vminss_avx(auVar67,auVar72);
          auVar70 = vmaxss_avx(auVar66,auVar70);
          auVar72 = vminss_avx(auVar75,auVar76);
          auVar66 = vmaxss_avx(auVar76,auVar75);
          auVar75 = vminss_avx512f(auVar73,auVar74);
          auVar76 = vmaxss_avx512f(auVar74,auVar73);
          auVar66 = vmaxss_avx(auVar76,auVar66);
          auVar72 = vminss_avx512f(auVar72,auVar75);
          vucomiss_avx512f(auVar67);
          fVar225 = auVar66._0_4_;
          fVar216 = auVar70._0_4_;
          if (uVar44 < 5) {
LAB_01ab3343:
            auVar75 = vucomiss_avx512f(auVar72);
            bVar55 = fVar225 <= -0.0001;
            bVar53 = -0.0001 < fVar216;
            bVar52 = bVar55;
            if (!bVar55) goto LAB_01ab3389;
            uVar21 = vcmpps_avx512vl(auVar67,auVar75,5);
            uVar22 = vcmpps_avx512vl(auVar72,auVar75,5);
            uVar48 = (uint)uVar21 & (uint)uVar22;
            bVar10 = (uVar48 & 1) == 0;
            bVar55 = bVar53 && bVar10;
            bVar52 = bVar53 && (uVar48 & 1) == 0;
            if (bVar53 && bVar10) goto LAB_01ab3389;
          }
          else {
            bVar55 = fVar225 == -0.0001;
            bVar52 = NAN(fVar225);
            if (fVar225 <= -0.0001) goto LAB_01ab3343;
LAB_01ab3389:
            auVar76 = vxorps_avx512vl(auVar65,auVar65);
            vcmpss_avx512f(auVar67,auVar76,1);
            uVar21 = vcmpss_avx512f(auVar70,auVar76,1);
            bVar53 = (bool)((byte)uVar21 & 1);
            auVar116._0_16_ = auVar267._0_16_;
            auVar268._4_60_ = auVar116._4_60_;
            auVar268._0_4_ = (float)((uint)bVar53 * -0x40800000 + (uint)!bVar53 * auVar267._0_4_);
            vucomiss_avx512f(auVar268._0_16_);
            bVar52 = (bool)(!bVar55 | bVar52);
            bVar53 = bVar52 == false;
            auVar106._16_48_ = auVar116._16_48_;
            auVar106._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar105._4_60_ = auVar106._4_60_;
            auVar105._0_4_ = (uint)bVar52 * auVar76._0_4_ + (uint)!bVar52 * 0x7f800000;
            auVar75 = auVar105._0_16_;
            auVar108._16_48_ = auVar116._16_48_;
            auVar108._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar107._4_60_ = auVar108._4_60_;
            auVar107._0_4_ = (uint)bVar52 * auVar76._0_4_ + (uint)!bVar52 * -0x800000;
            auVar65 = auVar107._0_16_;
            auVar71 = vxorps_avx512vl(auVar71,auVar71);
            uVar21 = vcmpss_avx512f(auVar72,auVar76,1);
            bVar55 = (bool)((byte)uVar21 & 1);
            auVar110._16_48_ = auVar116._16_48_;
            auVar110._0_16_ = auVar267._0_16_;
            auVar109._4_60_ = auVar110._4_60_;
            auVar109._0_4_ = (float)((uint)bVar55 * -0x40800000 + (uint)!bVar55 * auVar267._0_4_);
            vucomiss_avx512f(auVar109._0_16_);
            if ((bVar52) || (bVar53)) {
              auVar72 = vucomiss_avx512f(auVar67);
              if ((bVar52) || (bVar53)) {
                auVar76 = vxorps_avx512vl(auVar67,auVar260._0_16_);
                auVar67 = vsubss_avx512f(auVar72,auVar67);
                auVar67 = vdivss_avx512f(auVar76,auVar67);
                auVar72 = vsubss_avx512f(ZEXT416(0x3f800000),auVar67);
                auVar72 = vfmadd213ss_avx512f(auVar72,auVar71,auVar67);
                auVar67 = auVar72;
              }
              else {
                auVar72 = vxorps_avx512vl(auVar72,auVar72);
                vucomiss_avx512f(auVar72);
                if ((bVar52) || (auVar67 = ZEXT416(0x3f800000), bVar53)) {
                  auVar72 = ZEXT416(0x7f800000);
                  auVar67 = SUB6416(ZEXT464(0xff800000),0);
                }
              }
              auVar75 = vminss_avx512f(auVar75,auVar72);
              auVar65 = vmaxss_avx(auVar67,auVar65);
            }
            auVar267 = ZEXT464(0x3f800000);
            uVar21 = vcmpss_avx512f(auVar66,auVar71,1);
            bVar55 = (bool)((byte)uVar21 & 1);
            auVar66 = auVar267._0_16_;
            fVar226 = (float)((uint)bVar55 * -0x40800000 + (uint)!bVar55 * 0x3f800000);
            if ((auVar268._0_4_ != fVar226) || (NAN(auVar268._0_4_) || NAN(fVar226))) {
              if ((fVar225 != fVar216) || (NAN(fVar225) || NAN(fVar216))) {
                auVar70 = vxorps_avx512vl(auVar70,auVar260._0_16_);
                auVar204._0_4_ = auVar70._0_4_ / (fVar225 - fVar216);
                auVar204._4_12_ = auVar70._4_12_;
                auVar70 = vsubss_avx512f(auVar66,auVar204);
                auVar70 = vfmadd213ss_avx512f(auVar70,auVar71,auVar204);
                auVar67 = auVar70;
              }
              else if ((fVar216 != 0.0) ||
                      (auVar70 = auVar66, auVar67 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar216))) {
                auVar70 = SUB6416(ZEXT464(0xff800000),0);
                auVar67 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar75 = vminss_avx(auVar75,auVar67);
              auVar65 = vmaxss_avx(auVar70,auVar65);
            }
            bVar55 = auVar109._0_4_ != fVar226;
            auVar70 = vminss_avx512f(auVar75,auVar66);
            auVar112._16_48_ = auVar116._16_48_;
            auVar112._0_16_ = auVar75;
            auVar111._4_60_ = auVar112._4_60_;
            auVar111._0_4_ = (uint)bVar55 * auVar70._0_4_ + (uint)!bVar55 * auVar75._0_4_;
            auVar70 = vmaxss_avx512f(auVar66,auVar65);
            auVar114._16_48_ = auVar116._16_48_;
            auVar114._0_16_ = auVar65;
            auVar113._4_60_ = auVar114._4_60_;
            auVar113._0_4_ = (uint)bVar55 * auVar70._0_4_ + (uint)!bVar55 * auVar65._0_4_;
            auVar65 = vmaxss_avx512f(auVar71,auVar111._0_16_);
            auVar70 = vminss_avx512f(auVar113._0_16_,auVar66);
            if (auVar65._0_4_ <= auVar70._0_4_) {
              auVar72 = vmaxss_avx512f(auVar71,ZEXT416((uint)(auVar65._0_4_ + -0.1)));
              auVar77 = vminss_avx512f(ZEXT416((uint)(auVar70._0_4_ + 0.1)),auVar66);
              auVar148._0_8_ = auVar153._0_8_;
              auVar148._8_8_ = auVar148._0_8_;
              auVar219._8_8_ = auVar184._0_8_;
              auVar219._0_8_ = auVar184._0_8_;
              auVar232._8_8_ = auVar78._0_8_;
              auVar232._0_8_ = auVar78._0_8_;
              auVar65 = vshufpd_avx(auVar184,auVar184,3);
              auVar70 = vshufpd_avx(auVar78,auVar78,3);
              auVar67 = vshufps_avx(auVar72,auVar77,0);
              auVar76 = vsubps_avx512vl(auVar62,auVar67);
              fVar216 = auVar67._0_4_;
              auVar176._0_4_ = fVar216 * auVar79._0_4_;
              fVar225 = auVar67._4_4_;
              auVar176._4_4_ = fVar225 * auVar79._4_4_;
              fVar226 = auVar67._8_4_;
              auVar176._8_4_ = fVar226 * auVar79._8_4_;
              fVar228 = auVar67._12_4_;
              auVar176._12_4_ = fVar228 * auVar79._12_4_;
              auVar185._0_4_ = fVar216 * auVar65._0_4_;
              auVar185._4_4_ = fVar225 * auVar65._4_4_;
              auVar185._8_4_ = fVar226 * auVar65._8_4_;
              auVar185._12_4_ = fVar228 * auVar65._12_4_;
              auVar255._0_4_ = auVar70._0_4_ * fVar216;
              auVar255._4_4_ = auVar70._4_4_ * fVar225;
              auVar255._8_4_ = auVar70._8_4_ * fVar226;
              auVar255._12_4_ = auVar70._12_4_ * fVar228;
              auVar164._0_4_ = fVar216 * auVar80._0_4_;
              auVar164._4_4_ = fVar225 * auVar80._4_4_;
              auVar164._8_4_ = fVar226 * auVar80._8_4_;
              auVar164._12_4_ = fVar228 * auVar80._12_4_;
              auVar79 = vfmadd231ps_fma(auVar176,auVar76,auVar148);
              auVar80 = vfmadd231ps_fma(auVar185,auVar76,auVar219);
              auVar75 = vfmadd231ps_fma(auVar255,auVar76,auVar232);
              auVar76 = vfmadd231ps_fma(auVar164,auVar76,ZEXT816(0));
              auVar70 = vsubss_avx512f(auVar66,auVar72);
              auVar65 = vmovshdup_avx(auVar131);
              auVar153 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar72._0_4_)),auVar131,
                                         auVar70);
              auVar70 = vsubss_avx512f(auVar66,auVar77);
              auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar77._0_4_)),auVar131,
                                        auVar70);
              auVar78 = vdivss_avx512f(auVar66,ZEXT416((uint)fVar227));
              auVar65 = vsubps_avx(auVar80,auVar79);
              auVar243 = auVar125._0_16_;
              auVar67 = vmulps_avx512vl(auVar65,auVar243);
              auVar65 = vsubps_avx(auVar75,auVar80);
              auVar72 = vmulps_avx512vl(auVar65,auVar243);
              auVar65 = vsubps_avx(auVar76,auVar75);
              auVar65 = vmulps_avx512vl(auVar65,auVar243);
              auVar70 = vminps_avx(auVar72,auVar65);
              auVar65 = vmaxps_avx(auVar72,auVar65);
              auVar70 = vminps_avx(auVar67,auVar70);
              auVar65 = vmaxps_avx(auVar67,auVar65);
              auVar67 = vshufpd_avx(auVar70,auVar70,3);
              auVar72 = vshufpd_avx(auVar65,auVar65,3);
              auVar70 = vminps_avx(auVar70,auVar67);
              auVar65 = vmaxps_avx(auVar65,auVar72);
              fVar227 = auVar78._0_4_;
              auVar205._0_4_ = auVar70._0_4_ * fVar227;
              auVar205._4_4_ = auVar70._4_4_ * fVar227;
              auVar205._8_4_ = auVar70._8_4_ * fVar227;
              auVar205._12_4_ = auVar70._12_4_ * fVar227;
              auVar192._0_4_ = fVar227 * auVar65._0_4_;
              auVar192._4_4_ = fVar227 * auVar65._4_4_;
              auVar192._8_4_ = fVar227 * auVar65._8_4_;
              auVar192._12_4_ = fVar227 * auVar65._12_4_;
              auVar78 = vdivss_avx512f(auVar66,ZEXT416((uint)(auVar73._0_4_ - auVar153._0_4_)));
              auVar65 = vshufpd_avx(auVar79,auVar79,3);
              auVar70 = vshufpd_avx(auVar80,auVar80,3);
              auVar67 = vshufpd_avx(auVar75,auVar75,3);
              auVar72 = vshufpd_avx(auVar76,auVar76,3);
              auVar65 = vsubps_avx(auVar65,auVar79);
              auVar79 = vsubps_avx(auVar70,auVar80);
              auVar80 = vsubps_avx(auVar67,auVar75);
              auVar72 = vsubps_avx(auVar72,auVar76);
              auVar70 = vminps_avx(auVar65,auVar79);
              auVar65 = vmaxps_avx(auVar65,auVar79);
              auVar67 = vminps_avx(auVar80,auVar72);
              auVar67 = vminps_avx(auVar70,auVar67);
              auVar70 = vmaxps_avx(auVar80,auVar72);
              auVar65 = vmaxps_avx(auVar65,auVar70);
              fVar227 = auVar78._0_4_;
              auVar233._0_4_ = fVar227 * auVar67._0_4_;
              auVar233._4_4_ = fVar227 * auVar67._4_4_;
              auVar233._8_4_ = fVar227 * auVar67._8_4_;
              auVar233._12_4_ = fVar227 * auVar67._12_4_;
              auVar220._0_4_ = fVar227 * auVar65._0_4_;
              auVar220._4_4_ = fVar227 * auVar65._4_4_;
              auVar220._8_4_ = fVar227 * auVar65._8_4_;
              auVar220._12_4_ = fVar227 * auVar65._12_4_;
              auVar72 = vinsertps_avx(auVar57,auVar153,0x10);
              auVar74 = vpermt2ps_avx512vl(auVar57,_DAT_01feecd0,auVar73);
              auVar132._0_4_ = auVar72._0_4_ + auVar74._0_4_;
              auVar132._4_4_ = auVar72._4_4_ + auVar74._4_4_;
              auVar132._8_4_ = auVar72._8_4_ + auVar74._8_4_;
              auVar132._12_4_ = auVar72._12_4_ + auVar74._12_4_;
              auVar25._8_4_ = 0x3f000000;
              auVar25._0_8_ = 0x3f0000003f000000;
              auVar25._12_4_ = 0x3f000000;
              auVar78 = vmulps_avx512vl(auVar132,auVar25);
              auVar70 = vshufps_avx(auVar78,auVar78,0x54);
              uVar127 = auVar78._0_4_;
              auVar142._4_4_ = uVar127;
              auVar142._0_4_ = uVar127;
              auVar142._8_4_ = uVar127;
              auVar142._12_4_ = uVar127;
              auVar79 = vfmadd213ps_avx512vl(local_490,auVar142,auVar59);
              auVar80 = vfmadd213ps_avx512vl(local_4a0,auVar142,auVar68);
              auVar67 = vfmadd213ps_fma(local_4b0,auVar142,local_620);
              auVar65 = vsubps_avx(auVar80,auVar79);
              auVar79 = vfmadd213ps_fma(auVar65,auVar142,auVar79);
              auVar65 = vsubps_avx(auVar67,auVar80);
              auVar65 = vfmadd213ps_fma(auVar65,auVar142,auVar80);
              auVar65 = vsubps_avx(auVar65,auVar79);
              auVar67 = vfmadd231ps_fma(auVar79,auVar65,auVar142);
              auVar75 = vmulps_avx512vl(auVar65,auVar243);
              auVar245._8_8_ = auVar67._0_8_;
              auVar245._0_8_ = auVar67._0_8_;
              auVar65 = vshufpd_avx(auVar67,auVar67,3);
              auVar67 = vshufps_avx(auVar78,auVar78,0x55);
              auVar79 = vsubps_avx(auVar65,auVar245);
              auVar80 = vfmadd231ps_fma(auVar245,auVar67,auVar79);
              auVar256._8_8_ = auVar75._0_8_;
              auVar256._0_8_ = auVar75._0_8_;
              auVar65 = vshufpd_avx(auVar75,auVar75,3);
              auVar65 = vsubps_avx512vl(auVar65,auVar256);
              auVar65 = vfmadd213ps_avx512vl(auVar65,auVar67,auVar256);
              auVar143._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
              auVar143._8_4_ = auVar79._8_4_ ^ 0x80000000;
              auVar143._12_4_ = auVar79._12_4_ ^ 0x80000000;
              auVar67 = vmovshdup_avx512vl(auVar65);
              auVar257._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
              auVar257._8_4_ = auVar67._8_4_ ^ 0x80000000;
              auVar257._12_4_ = auVar67._12_4_ ^ 0x80000000;
              auVar75 = vmovshdup_avx512vl(auVar79);
              auVar76 = vpermt2ps_avx512vl(auVar257,ZEXT416(5),auVar79);
              auVar67 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar67._0_4_ * auVar79._0_4_)),auVar65,
                                            auVar75);
              auVar79 = vpermt2ps_avx512vl(auVar65,SUB6416(ZEXT464(4),0),auVar143);
              auVar165._0_4_ = auVar67._0_4_;
              auVar165._4_4_ = auVar165._0_4_;
              auVar165._8_4_ = auVar165._0_4_;
              auVar165._12_4_ = auVar165._0_4_;
              auVar65 = vdivps_avx(auVar76,auVar165);
              auVar81 = vdivps_avx512vl(auVar79,auVar165);
              fVar227 = auVar80._0_4_;
              auVar67 = vshufps_avx(auVar80,auVar80,0x55);
              auVar246._0_4_ = fVar227 * auVar65._0_4_ + auVar67._0_4_ * auVar81._0_4_;
              auVar246._4_4_ = fVar227 * auVar65._4_4_ + auVar67._4_4_ * auVar81._4_4_;
              auVar246._8_4_ = fVar227 * auVar65._8_4_ + auVar67._8_4_ * auVar81._8_4_;
              auVar246._12_4_ = fVar227 * auVar65._12_4_ + auVar67._12_4_ * auVar81._12_4_;
              auVar77 = vsubps_avx(auVar70,auVar246);
              auVar67 = vmovshdup_avx(auVar65);
              auVar70 = vinsertps_avx(auVar205,auVar233,0x1c);
              auVar258._0_4_ = auVar67._0_4_ * auVar70._0_4_;
              auVar258._4_4_ = auVar67._4_4_ * auVar70._4_4_;
              auVar258._8_4_ = auVar67._8_4_ * auVar70._8_4_;
              auVar258._12_4_ = auVar67._12_4_ * auVar70._12_4_;
              auVar83 = vinsertps_avx512f(auVar192,auVar220,0x1c);
              auVar67 = vmulps_avx512vl(auVar67,auVar83);
              auVar76 = vminps_avx512vl(auVar258,auVar67);
              auVar80 = vmaxps_avx(auVar67,auVar258);
              auVar75 = vmovshdup_avx(auVar81);
              auVar67 = vinsertps_avx(auVar233,auVar205,0x4c);
              auVar234._0_4_ = auVar75._0_4_ * auVar67._0_4_;
              auVar234._4_4_ = auVar75._4_4_ * auVar67._4_4_;
              auVar234._8_4_ = auVar75._8_4_ * auVar67._8_4_;
              auVar234._12_4_ = auVar75._12_4_ * auVar67._12_4_;
              auVar79 = vinsertps_avx(auVar220,auVar192,0x4c);
              auVar221._0_4_ = auVar75._0_4_ * auVar79._0_4_;
              auVar221._4_4_ = auVar75._4_4_ * auVar79._4_4_;
              auVar221._8_4_ = auVar75._8_4_ * auVar79._8_4_;
              auVar221._12_4_ = auVar75._12_4_ * auVar79._12_4_;
              auVar75 = vminps_avx(auVar234,auVar221);
              auVar76 = vaddps_avx512vl(auVar76,auVar75);
              auVar75 = vmaxps_avx(auVar221,auVar234);
              auVar222._0_4_ = auVar80._0_4_ + auVar75._0_4_;
              auVar222._4_4_ = auVar80._4_4_ + auVar75._4_4_;
              auVar222._8_4_ = auVar80._8_4_ + auVar75._8_4_;
              auVar222._12_4_ = auVar80._12_4_ + auVar75._12_4_;
              auVar235._8_8_ = 0x3f80000000000000;
              auVar235._0_8_ = 0x3f80000000000000;
              auVar80 = vsubps_avx(auVar235,auVar222);
              auVar75 = vsubps_avx(auVar235,auVar76);
              auVar76 = vsubps_avx(auVar72,auVar78);
              auVar78 = vsubps_avx(auVar74,auVar78);
              fVar228 = auVar76._0_4_;
              auVar259._0_4_ = fVar228 * auVar80._0_4_;
              fVar239 = auVar76._4_4_;
              auVar259._4_4_ = fVar239 * auVar80._4_4_;
              fVar240 = auVar76._8_4_;
              auVar259._8_4_ = fVar240 * auVar80._8_4_;
              fVar241 = auVar76._12_4_;
              auVar259._12_4_ = fVar241 * auVar80._12_4_;
              auVar82 = vbroadcastss_avx512vl(auVar65);
              auVar70 = vmulps_avx512vl(auVar82,auVar70);
              auVar83 = vmulps_avx512vl(auVar82,auVar83);
              auVar82 = vminps_avx512vl(auVar70,auVar83);
              auVar83 = vmaxps_avx512vl(auVar83,auVar70);
              auVar70 = vbroadcastss_avx512vl(auVar81);
              auVar67 = vmulps_avx512vl(auVar70,auVar67);
              auVar70 = vmulps_avx512vl(auVar70,auVar79);
              auVar79 = vminps_avx512vl(auVar67,auVar70);
              auVar79 = vaddps_avx512vl(auVar82,auVar79);
              auVar76 = vmulps_avx512vl(auVar76,auVar75);
              fVar227 = auVar78._0_4_;
              auVar223._0_4_ = fVar227 * auVar80._0_4_;
              fVar216 = auVar78._4_4_;
              auVar223._4_4_ = fVar216 * auVar80._4_4_;
              fVar225 = auVar78._8_4_;
              auVar223._8_4_ = fVar225 * auVar80._8_4_;
              fVar226 = auVar78._12_4_;
              auVar223._12_4_ = fVar226 * auVar80._12_4_;
              auVar236._0_4_ = fVar227 * auVar75._0_4_;
              auVar236._4_4_ = fVar216 * auVar75._4_4_;
              auVar236._8_4_ = fVar225 * auVar75._8_4_;
              auVar236._12_4_ = fVar226 * auVar75._12_4_;
              auVar70 = vmaxps_avx(auVar70,auVar67);
              auVar193._0_4_ = auVar83._0_4_ + auVar70._0_4_;
              auVar193._4_4_ = auVar83._4_4_ + auVar70._4_4_;
              auVar193._8_4_ = auVar83._8_4_ + auVar70._8_4_;
              auVar193._12_4_ = auVar83._12_4_ + auVar70._12_4_;
              auVar206._8_8_ = 0x3f800000;
              auVar206._0_8_ = 0x3f800000;
              auVar70 = vsubps_avx(auVar206,auVar193);
              auVar67 = vsubps_avx512vl(auVar206,auVar79);
              auVar253._0_4_ = fVar228 * auVar70._0_4_;
              auVar253._4_4_ = fVar239 * auVar70._4_4_;
              auVar253._8_4_ = fVar240 * auVar70._8_4_;
              auVar253._12_4_ = fVar241 * auVar70._12_4_;
              auVar247._0_4_ = fVar228 * auVar67._0_4_;
              auVar247._4_4_ = fVar239 * auVar67._4_4_;
              auVar247._8_4_ = fVar240 * auVar67._8_4_;
              auVar247._12_4_ = fVar241 * auVar67._12_4_;
              auVar194._0_4_ = fVar227 * auVar70._0_4_;
              auVar194._4_4_ = fVar216 * auVar70._4_4_;
              auVar194._8_4_ = fVar225 * auVar70._8_4_;
              auVar194._12_4_ = fVar226 * auVar70._12_4_;
              auVar207._0_4_ = fVar227 * auVar67._0_4_;
              auVar207._4_4_ = fVar216 * auVar67._4_4_;
              auVar207._8_4_ = fVar225 * auVar67._8_4_;
              auVar207._12_4_ = fVar226 * auVar67._12_4_;
              auVar70 = vminps_avx(auVar253,auVar247);
              auVar67 = vminps_avx512vl(auVar194,auVar207);
              auVar79 = vminps_avx512vl(auVar70,auVar67);
              auVar70 = vmaxps_avx(auVar247,auVar253);
              auVar67 = vmaxps_avx(auVar207,auVar194);
              auVar67 = vmaxps_avx(auVar67,auVar70);
              auVar80 = vminps_avx512vl(auVar259,auVar76);
              auVar70 = vminps_avx(auVar223,auVar236);
              auVar70 = vminps_avx(auVar80,auVar70);
              auVar70 = vhaddps_avx(auVar79,auVar70);
              auVar80 = vmaxps_avx512vl(auVar76,auVar259);
              auVar79 = vmaxps_avx(auVar236,auVar223);
              auVar79 = vmaxps_avx(auVar79,auVar80);
              auVar67 = vhaddps_avx(auVar67,auVar79);
              auVar70 = vshufps_avx(auVar70,auVar70,0xe8);
              auVar67 = vshufps_avx(auVar67,auVar67,0xe8);
              auVar195._0_4_ = auVar70._0_4_ + auVar77._0_4_;
              auVar195._4_4_ = auVar70._4_4_ + auVar77._4_4_;
              auVar195._8_4_ = auVar70._8_4_ + auVar77._8_4_;
              auVar195._12_4_ = auVar70._12_4_ + auVar77._12_4_;
              auVar208._0_4_ = auVar67._0_4_ + auVar77._0_4_;
              auVar208._4_4_ = auVar67._4_4_ + auVar77._4_4_;
              auVar208._8_4_ = auVar67._8_4_ + auVar77._8_4_;
              auVar208._12_4_ = auVar67._12_4_ + auVar77._12_4_;
              auVar70 = vmaxps_avx(auVar72,auVar195);
              auVar67 = vminps_avx(auVar208,auVar74);
              uVar49 = vcmpps_avx512vl(auVar67,auVar70,1);
              if ((uVar49 & 3) == 0) {
                uVar49 = vcmpps_avx512vl(auVar208,auVar74,1);
                uVar21 = vcmpps_avx512vl(auVar57,auVar195,1);
                if (((ushort)uVar21 & (ushort)uVar49 & 1) == 0) {
                  bVar43 = 0;
                }
                else {
                  auVar70 = vmovshdup_avx(auVar195);
                  bVar43 = auVar153._0_4_ < auVar70._0_4_ & (byte)(uVar49 >> 1) & 0x7f;
                }
                if (((3 < uVar44 || uVar5 != 0 && !bVar54) | bVar43) != 1) {
                  auVar131 = vinsertps_avx(auVar153,auVar73,0x10);
                  auVar266 = ZEXT1664(local_630);
                  auVar268 = ZEXT1664(local_640);
                  goto LAB_01ab2c1f;
                }
                lVar47 = 200;
                do {
                  auVar57 = vsubss_avx512f(auVar66,auVar77);
                  fVar225 = auVar57._0_4_;
                  fVar227 = fVar225 * fVar225 * fVar225;
                  auVar57 = vmulss_avx512f(auVar77,ZEXT416(0x40400000));
                  fVar216 = auVar57._0_4_ * fVar225 * fVar225;
                  fVar226 = auVar77._0_4_;
                  auVar67 = ZEXT416(0x40400000);
                  auVar57 = vmulss_avx512f(ZEXT416((uint)(fVar226 * fVar226)),auVar67);
                  fVar225 = fVar225 * auVar57._0_4_;
                  auVar155._4_4_ = fVar227;
                  auVar155._0_4_ = fVar227;
                  auVar155._8_4_ = fVar227;
                  auVar155._12_4_ = fVar227;
                  auVar149._4_4_ = fVar216;
                  auVar149._0_4_ = fVar216;
                  auVar149._8_4_ = fVar216;
                  auVar149._12_4_ = fVar216;
                  auVar122._4_4_ = fVar225;
                  auVar122._0_4_ = fVar225;
                  auVar122._8_4_ = fVar225;
                  auVar122._12_4_ = fVar225;
                  fVar226 = fVar226 * fVar226 * fVar226;
                  auVar177._0_4_ = (float)local_480._0_4_ * fVar226;
                  auVar177._4_4_ = (float)local_480._4_4_ * fVar226;
                  auVar177._8_4_ = fStack_478 * fVar226;
                  auVar177._12_4_ = fStack_474 * fVar226;
                  auVar57 = vfmadd231ps_fma(auVar177,local_620,auVar122);
                  auVar57 = vfmadd231ps_fma(auVar57,auVar68,auVar149);
                  auVar57 = vfmadd231ps_fma(auVar57,auVar59,auVar155);
                  auVar123._8_8_ = auVar57._0_8_;
                  auVar123._0_8_ = auVar57._0_8_;
                  auVar57 = vshufpd_avx(auVar57,auVar57,3);
                  auVar70 = vshufps_avx(auVar77,auVar77,0x55);
                  auVar57 = vsubps_avx(auVar57,auVar123);
                  auVar70 = vfmadd213ps_fma(auVar57,auVar70,auVar123);
                  fVar227 = auVar70._0_4_;
                  auVar57 = vshufps_avx(auVar70,auVar70,0x55);
                  auVar124._0_4_ = auVar65._0_4_ * fVar227 + auVar81._0_4_ * auVar57._0_4_;
                  auVar124._4_4_ = auVar65._4_4_ * fVar227 + auVar81._4_4_ * auVar57._4_4_;
                  auVar124._8_4_ = auVar65._8_4_ * fVar227 + auVar81._8_4_ * auVar57._8_4_;
                  auVar124._12_4_ = auVar65._12_4_ * fVar227 + auVar81._12_4_ * auVar57._12_4_;
                  auVar77 = vsubps_avx(auVar77,auVar124);
                  auVar57 = vandps_avx512vl(auVar70,auVar264._0_16_);
                  auVar70 = vprolq_avx512vl(auVar57,0x20);
                  auVar57 = vmaxss_avx(auVar70,auVar57);
                  bVar54 = (float)local_470._0_4_ < auVar57._0_4_;
                  if (auVar57._0_4_ < (float)local_470._0_4_) {
                    auVar57 = vucomiss_avx512f(auVar71);
                    if (bVar54) break;
                    auVar65 = vucomiss_avx512f(auVar57);
                    auVar267 = ZEXT1664(auVar65);
                    if (bVar54) break;
                    vmovshdup_avx(auVar57);
                    auVar65 = vucomiss_avx512f(auVar71);
                    if (bVar54) break;
                    auVar71 = vucomiss_avx512f(auVar65);
                    auVar267 = ZEXT1664(auVar71);
                    if (bVar54) break;
                    auVar70 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar78 = vinsertps_avx(auVar70,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar70 = vdpps_avx(auVar78,local_4c0,0x7f);
                    auVar66 = vdpps_avx(auVar78,local_4d0,0x7f);
                    auVar72 = vdpps_avx(auVar78,local_4e0,0x7f);
                    auVar79 = vdpps_avx(auVar78,local_4f0,0x7f);
                    auVar80 = vdpps_avx(auVar78,local_500,0x7f);
                    auVar75 = vdpps_avx(auVar78,local_510,0x7f);
                    auVar76 = vdpps_avx(auVar78,local_520,0x7f);
                    auVar78 = vdpps_avx(auVar78,local_530,0x7f);
                    auVar77 = vsubss_avx512f(auVar71,auVar65);
                    fVar228 = auVar65._0_4_;
                    auVar65 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * auVar80._0_4_)),auVar77,
                                              auVar70);
                    auVar70 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * fVar228)),auVar77,
                                              auVar66);
                    auVar66 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * fVar228)),auVar77,
                                              auVar72);
                    auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * auVar78._0_4_)),auVar77,
                                              auVar79);
                    auVar71 = vsubss_avx512f(auVar71,auVar57);
                    auVar186._0_4_ = auVar71._0_4_;
                    fVar216 = auVar186._0_4_ * auVar186._0_4_ * auVar186._0_4_;
                    auVar71 = vmulss_avx512f(auVar57,auVar67);
                    fVar225 = auVar71._0_4_ * auVar186._0_4_ * auVar186._0_4_;
                    fVar227 = auVar57._0_4_;
                    auVar178._0_4_ = fVar227 * fVar227;
                    auVar178._4_4_ = auVar57._4_4_ * auVar57._4_4_;
                    auVar178._8_4_ = auVar57._8_4_ * auVar57._8_4_;
                    auVar178._12_4_ = auVar57._12_4_ * auVar57._12_4_;
                    auVar71 = vmulss_avx512f(auVar178,auVar67);
                    fVar226 = auVar186._0_4_ * auVar71._0_4_;
                    fVar240 = fVar227 * auVar178._0_4_;
                    auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * auVar72._0_4_)),
                                              ZEXT416((uint)fVar226),auVar66);
                    auVar71 = vfmadd231ss_fma(auVar71,ZEXT416((uint)fVar225),auVar70);
                    auVar65 = vfmadd231ss_fma(auVar71,ZEXT416((uint)fVar216),auVar65);
                    fVar239 = auVar65._0_4_;
                    if ((fVar239 < fVar118) ||
                       (fVar241 = *(float *)(ray + k * 4 + 0x200), fVar241 < fVar239)) break;
                    auVar65 = vshufps_avx(auVar57,auVar57,0x55);
                    auVar62 = vsubps_avx512vl(auVar62,auVar65);
                    fVar242 = auVar65._0_4_;
                    auVar214._0_4_ = fVar242 * (float)local_550._0_4_;
                    fVar248 = auVar65._4_4_;
                    auVar214._4_4_ = fVar248 * (float)local_550._4_4_;
                    fVar249 = auVar65._8_4_;
                    auVar214._8_4_ = fVar249 * fStack_548;
                    fVar250 = auVar65._12_4_;
                    auVar214._12_4_ = fVar250 * fStack_544;
                    auVar224._0_4_ = fVar242 * (float)local_5a0._0_4_;
                    auVar224._4_4_ = fVar248 * (float)local_5a0._4_4_;
                    auVar224._8_4_ = fVar249 * fStack_598;
                    auVar224._12_4_ = fVar250 * fStack_594;
                    auVar237._0_4_ = fVar242 * (float)local_5b0._0_4_;
                    auVar237._4_4_ = fVar248 * (float)local_5b0._4_4_;
                    auVar237._8_4_ = fVar249 * fStack_5a8;
                    auVar237._12_4_ = fVar250 * fStack_5a4;
                    auVar196._0_4_ = fVar242 * (float)local_570._0_4_;
                    auVar196._4_4_ = fVar248 * (float)local_570._4_4_;
                    auVar196._8_4_ = fVar249 * fStack_568;
                    auVar196._12_4_ = fVar250 * fStack_564;
                    auVar65 = vfmadd231ps_fma(auVar214,auVar62,local_540);
                    auVar71 = vfmadd231ps_fma(auVar224,auVar62,local_580);
                    auVar70 = vfmadd231ps_fma(auVar237,auVar62,local_590);
                    auVar62 = vfmadd231ps_fma(auVar196,auVar62,local_560);
                    auVar65 = vsubps_avx(auVar71,auVar65);
                    auVar71 = vsubps_avx(auVar70,auVar71);
                    auVar70 = vsubps_avx(auVar62,auVar70);
                    auVar238._0_4_ = fVar227 * auVar71._0_4_;
                    auVar238._4_4_ = fVar227 * auVar71._4_4_;
                    auVar238._8_4_ = fVar227 * auVar71._8_4_;
                    auVar238._12_4_ = fVar227 * auVar71._12_4_;
                    auVar186._4_4_ = auVar186._0_4_;
                    auVar186._8_4_ = auVar186._0_4_;
                    auVar186._12_4_ = auVar186._0_4_;
                    auVar65 = vfmadd231ps_fma(auVar238,auVar186,auVar65);
                    auVar197._0_4_ = fVar227 * auVar70._0_4_;
                    auVar197._4_4_ = fVar227 * auVar70._4_4_;
                    auVar197._8_4_ = fVar227 * auVar70._8_4_;
                    auVar197._12_4_ = fVar227 * auVar70._12_4_;
                    auVar71 = vfmadd231ps_fma(auVar197,auVar186,auVar71);
                    auVar198._0_4_ = fVar227 * auVar71._0_4_;
                    auVar198._4_4_ = fVar227 * auVar71._4_4_;
                    auVar198._8_4_ = fVar227 * auVar71._8_4_;
                    auVar198._12_4_ = fVar227 * auVar71._12_4_;
                    auVar65 = vfmadd231ps_fma(auVar198,auVar186,auVar65);
                    auVar65 = vmulps_avx512vl(auVar65,auVar243);
                    pGVar6 = (context->scene->geometries).items[uVar51].ptr;
                    if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                    auVar179._0_4_ = fVar240 * (float)local_5f0._0_4_;
                    auVar179._4_4_ = fVar240 * (float)local_5f0._4_4_;
                    auVar179._8_4_ = fVar240 * fStack_5e8;
                    auVar179._12_4_ = fVar240 * fStack_5e4;
                    auVar166._4_4_ = fVar226;
                    auVar166._0_4_ = fVar226;
                    auVar166._8_4_ = fVar226;
                    auVar166._12_4_ = fVar226;
                    auVar71 = vfmadd132ps_fma(auVar166,auVar179,local_5e0);
                    auVar156._4_4_ = fVar225;
                    auVar156._0_4_ = fVar225;
                    auVar156._8_4_ = fVar225;
                    auVar156._12_4_ = fVar225;
                    auVar71 = vfmadd132ps_fma(auVar156,auVar71,local_5d0);
                    auVar150._4_4_ = fVar216;
                    auVar150._0_4_ = fVar216;
                    auVar150._8_4_ = fVar216;
                    auVar150._12_4_ = fVar216;
                    auVar62 = vfmadd132ps_fma(auVar150,auVar71,local_5c0);
                    auVar71 = vshufps_avx(auVar62,auVar62,0xc9);
                    auVar70 = vshufps_avx(auVar65,auVar65,0xc9);
                    auVar151._0_4_ = auVar62._0_4_ * auVar70._0_4_;
                    auVar151._4_4_ = auVar62._4_4_ * auVar70._4_4_;
                    auVar151._8_4_ = auVar62._8_4_ * auVar70._8_4_;
                    auVar151._12_4_ = auVar62._12_4_ * auVar70._12_4_;
                    auVar65 = vfmsub231ps_fma(auVar151,auVar65,auVar71);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x200) = fVar239;
                      uVar127 = vextractps_avx(auVar65,1);
                      *(undefined4 *)(ray + k * 4 + 0x300) = uVar127;
                      uVar127 = vextractps_avx(auVar65,2);
                      *(undefined4 *)(ray + k * 4 + 0x340) = uVar127;
                      *(int *)(ray + k * 4 + 0x380) = auVar65._0_4_;
                      *(float *)(ray + k * 4 + 0x3c0) = fVar227;
                      *(float *)(ray + k * 4 + 0x400) = fVar228;
                      *(uint *)(ray + k * 4 + 0x440) = uVar4;
                      *(uint *)(ray + k * 4 + 0x480) = uVar51;
                      *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      break;
                    }
                    local_200 = vbroadcastss_avx512f(auVar57);
                    auVar116 = vbroadcastss_avx512f(ZEXT416(1));
                    local_1c0 = vpermps_avx512f(auVar116,ZEXT1664(auVar57));
                    auVar116 = vpermps_avx512f(auVar116,ZEXT1664(auVar65));
                    auVar266 = vbroadcastss_avx512f(ZEXT416(2));
                    local_280 = vpermps_avx512f(auVar266,ZEXT1664(auVar65));
                    local_240 = vbroadcastss_avx512f(auVar65);
                    local_2c0[0] = (RTCHitN)auVar116[0];
                    local_2c0[1] = (RTCHitN)auVar116[1];
                    local_2c0[2] = (RTCHitN)auVar116[2];
                    local_2c0[3] = (RTCHitN)auVar116[3];
                    local_2c0[4] = (RTCHitN)auVar116[4];
                    local_2c0[5] = (RTCHitN)auVar116[5];
                    local_2c0[6] = (RTCHitN)auVar116[6];
                    local_2c0[7] = (RTCHitN)auVar116[7];
                    local_2c0[8] = (RTCHitN)auVar116[8];
                    local_2c0[9] = (RTCHitN)auVar116[9];
                    local_2c0[10] = (RTCHitN)auVar116[10];
                    local_2c0[0xb] = (RTCHitN)auVar116[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar116[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar116[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar116[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar116[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar116[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar116[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar116[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar116[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar116[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar116[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar116[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar116[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar116[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar116[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar116[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar116[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar116[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar116[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar116[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar116[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar116[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar116[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar116[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar116[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar116[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar116[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar116[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar116[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar116[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar116[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar116[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar116[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar116[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar116[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar116[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar116[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar116[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar116[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar116[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar116[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar116[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar116[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar116[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar116[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar116[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar116[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar116[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar116[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar116[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar116[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar116[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar116[0x3f];
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar116 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar116);
                    vpcmpeqd_avx2(auVar116._0_32_,auVar116._0_32_);
                    local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar239;
                    auVar116 = vmovdqa64_avx512f(local_380);
                    local_440 = vmovdqa64_avx512f(auVar116);
                    local_670.valid = (int *)local_440;
                    local_670.geometryUserPtr = pGVar6->userPtr;
                    local_670.context = context->user;
                    local_670.hit = local_2c0;
                    local_670.N = 0x10;
                    local_670.ray = (RTCRayN *)ray;
                    if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar6->intersectionFilterN)(&local_670);
                      auVar267 = ZEXT464(0x3f800000);
                      auVar263 = ZEXT3264(_DAT_01feed20);
                      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar262 = ZEXT1664(auVar57);
                      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar261 = ZEXT3264(auVar101);
                      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar260 = ZEXT1664(auVar57);
                      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar125 = ZEXT1664(auVar57);
                      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar265 = ZEXT1664(auVar57);
                      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar264 = ZEXT1664(auVar57);
                      auVar116 = vmovdqa64_avx512f(local_440);
                    }
                    uVar21 = vptestmd_avx512f(auVar116,auVar116);
                    if ((short)uVar21 != 0) {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)(&local_670);
                        auVar267 = ZEXT464(0x3f800000);
                        auVar263 = ZEXT3264(_DAT_01feed20);
                        auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar262 = ZEXT1664(auVar57);
                        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar261 = ZEXT3264(auVar101);
                        auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar260 = ZEXT1664(auVar57);
                        auVar57 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar125 = ZEXT1664(auVar57);
                        auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar265 = ZEXT1664(auVar57);
                        auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar264 = ZEXT1664(auVar57);
                        auVar116 = vmovdqa64_avx512f(local_440);
                      }
                      uVar49 = vptestmd_avx512f(auVar116,auVar116);
                      if ((short)uVar49 != 0) {
                        iVar28 = *(int *)(local_670.hit + 4);
                        iVar29 = *(int *)(local_670.hit + 8);
                        iVar30 = *(int *)(local_670.hit + 0xc);
                        iVar31 = *(int *)(local_670.hit + 0x10);
                        iVar32 = *(int *)(local_670.hit + 0x14);
                        iVar33 = *(int *)(local_670.hit + 0x18);
                        iVar34 = *(int *)(local_670.hit + 0x1c);
                        iVar35 = *(int *)(local_670.hit + 0x20);
                        iVar36 = *(int *)(local_670.hit + 0x24);
                        iVar37 = *(int *)(local_670.hit + 0x28);
                        iVar38 = *(int *)(local_670.hit + 0x2c);
                        iVar39 = *(int *)(local_670.hit + 0x30);
                        iVar40 = *(int *)(local_670.hit + 0x34);
                        iVar41 = *(int *)(local_670.hit + 0x38);
                        iVar42 = *(int *)(local_670.hit + 0x3c);
                        bVar43 = (byte)uVar49;
                        bVar54 = (bool)((byte)(uVar49 >> 1) & 1);
                        bVar55 = (bool)((byte)(uVar49 >> 2) & 1);
                        bVar52 = (bool)((byte)(uVar49 >> 3) & 1);
                        bVar53 = (bool)((byte)(uVar49 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar49 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar49 >> 6) & 1);
                        bVar12 = (bool)((byte)(uVar49 >> 7) & 1);
                        bVar13 = (byte)(uVar49 >> 8);
                        bVar14 = (bool)((byte)(uVar49 >> 9) & 1);
                        bVar15 = (bool)((byte)(uVar49 >> 10) & 1);
                        bVar16 = (bool)((byte)(uVar49 >> 0xb) & 1);
                        bVar17 = (bool)((byte)(uVar49 >> 0xc) & 1);
                        bVar18 = (bool)((byte)(uVar49 >> 0xd) & 1);
                        bVar19 = (bool)((byte)(uVar49 >> 0xe) & 1);
                        bVar20 = SUB81(uVar49 >> 0xf,0);
                        *(uint *)(local_670.ray + 0x300) =
                             (uint)(bVar43 & 1) * *(int *)local_670.hit |
                             (uint)!(bool)(bVar43 & 1) * *(int *)(local_670.ray + 0x300);
                        *(uint *)(local_670.ray + 0x304) =
                             (uint)bVar54 * iVar28 | (uint)!bVar54 * *(int *)(local_670.ray + 0x304)
                        ;
                        *(uint *)(local_670.ray + 0x308) =
                             (uint)bVar55 * iVar29 | (uint)!bVar55 * *(int *)(local_670.ray + 0x308)
                        ;
                        *(uint *)(local_670.ray + 0x30c) =
                             (uint)bVar52 * iVar30 | (uint)!bVar52 * *(int *)(local_670.ray + 0x30c)
                        ;
                        *(uint *)(local_670.ray + 0x310) =
                             (uint)bVar53 * iVar31 | (uint)!bVar53 * *(int *)(local_670.ray + 0x310)
                        ;
                        *(uint *)(local_670.ray + 0x314) =
                             (uint)bVar10 * iVar32 | (uint)!bVar10 * *(int *)(local_670.ray + 0x314)
                        ;
                        *(uint *)(local_670.ray + 0x318) =
                             (uint)bVar11 * iVar33 | (uint)!bVar11 * *(int *)(local_670.ray + 0x318)
                        ;
                        *(uint *)(local_670.ray + 0x31c) =
                             (uint)bVar12 * iVar34 | (uint)!bVar12 * *(int *)(local_670.ray + 0x31c)
                        ;
                        *(uint *)(local_670.ray + 800) =
                             (uint)(bVar13 & 1) * iVar35 |
                             (uint)!(bool)(bVar13 & 1) * *(int *)(local_670.ray + 800);
                        *(uint *)(local_670.ray + 0x324) =
                             (uint)bVar14 * iVar36 | (uint)!bVar14 * *(int *)(local_670.ray + 0x324)
                        ;
                        *(uint *)(local_670.ray + 0x328) =
                             (uint)bVar15 * iVar37 | (uint)!bVar15 * *(int *)(local_670.ray + 0x328)
                        ;
                        *(uint *)(local_670.ray + 0x32c) =
                             (uint)bVar16 * iVar38 | (uint)!bVar16 * *(int *)(local_670.ray + 0x32c)
                        ;
                        *(uint *)(local_670.ray + 0x330) =
                             (uint)bVar17 * iVar39 | (uint)!bVar17 * *(int *)(local_670.ray + 0x330)
                        ;
                        *(uint *)(local_670.ray + 0x334) =
                             (uint)bVar18 * iVar40 | (uint)!bVar18 * *(int *)(local_670.ray + 0x334)
                        ;
                        *(uint *)(local_670.ray + 0x338) =
                             (uint)bVar19 * iVar41 | (uint)!bVar19 * *(int *)(local_670.ray + 0x338)
                        ;
                        *(uint *)(local_670.ray + 0x33c) =
                             (uint)bVar20 * iVar42 | (uint)!bVar20 * *(int *)(local_670.ray + 0x33c)
                        ;
                        iVar28 = *(int *)(local_670.hit + 0x44);
                        iVar29 = *(int *)(local_670.hit + 0x48);
                        iVar30 = *(int *)(local_670.hit + 0x4c);
                        iVar31 = *(int *)(local_670.hit + 0x50);
                        iVar32 = *(int *)(local_670.hit + 0x54);
                        iVar33 = *(int *)(local_670.hit + 0x58);
                        iVar34 = *(int *)(local_670.hit + 0x5c);
                        iVar35 = *(int *)(local_670.hit + 0x60);
                        iVar36 = *(int *)(local_670.hit + 100);
                        iVar37 = *(int *)(local_670.hit + 0x68);
                        iVar38 = *(int *)(local_670.hit + 0x6c);
                        iVar39 = *(int *)(local_670.hit + 0x70);
                        iVar40 = *(int *)(local_670.hit + 0x74);
                        iVar41 = *(int *)(local_670.hit + 0x78);
                        iVar42 = *(int *)(local_670.hit + 0x7c);
                        bVar54 = (bool)((byte)(uVar49 >> 1) & 1);
                        bVar55 = (bool)((byte)(uVar49 >> 2) & 1);
                        bVar52 = (bool)((byte)(uVar49 >> 3) & 1);
                        bVar53 = (bool)((byte)(uVar49 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar49 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar49 >> 6) & 1);
                        bVar12 = (bool)((byte)(uVar49 >> 7) & 1);
                        bVar14 = (bool)((byte)(uVar49 >> 9) & 1);
                        bVar15 = (bool)((byte)(uVar49 >> 10) & 1);
                        bVar16 = (bool)((byte)(uVar49 >> 0xb) & 1);
                        bVar17 = (bool)((byte)(uVar49 >> 0xc) & 1);
                        bVar18 = (bool)((byte)(uVar49 >> 0xd) & 1);
                        bVar19 = (bool)((byte)(uVar49 >> 0xe) & 1);
                        bVar20 = SUB81(uVar49 >> 0xf,0);
                        *(uint *)(local_670.ray + 0x340) =
                             (uint)(bVar43 & 1) * *(int *)(local_670.hit + 0x40) |
                             (uint)!(bool)(bVar43 & 1) * *(int *)(local_670.ray + 0x340);
                        *(uint *)(local_670.ray + 0x344) =
                             (uint)bVar54 * iVar28 | (uint)!bVar54 * *(int *)(local_670.ray + 0x344)
                        ;
                        *(uint *)(local_670.ray + 0x348) =
                             (uint)bVar55 * iVar29 | (uint)!bVar55 * *(int *)(local_670.ray + 0x348)
                        ;
                        *(uint *)(local_670.ray + 0x34c) =
                             (uint)bVar52 * iVar30 | (uint)!bVar52 * *(int *)(local_670.ray + 0x34c)
                        ;
                        *(uint *)(local_670.ray + 0x350) =
                             (uint)bVar53 * iVar31 | (uint)!bVar53 * *(int *)(local_670.ray + 0x350)
                        ;
                        *(uint *)(local_670.ray + 0x354) =
                             (uint)bVar10 * iVar32 | (uint)!bVar10 * *(int *)(local_670.ray + 0x354)
                        ;
                        *(uint *)(local_670.ray + 0x358) =
                             (uint)bVar11 * iVar33 | (uint)!bVar11 * *(int *)(local_670.ray + 0x358)
                        ;
                        *(uint *)(local_670.ray + 0x35c) =
                             (uint)bVar12 * iVar34 | (uint)!bVar12 * *(int *)(local_670.ray + 0x35c)
                        ;
                        *(uint *)(local_670.ray + 0x360) =
                             (uint)(bVar13 & 1) * iVar35 |
                             (uint)!(bool)(bVar13 & 1) * *(int *)(local_670.ray + 0x360);
                        *(uint *)(local_670.ray + 0x364) =
                             (uint)bVar14 * iVar36 | (uint)!bVar14 * *(int *)(local_670.ray + 0x364)
                        ;
                        *(uint *)(local_670.ray + 0x368) =
                             (uint)bVar15 * iVar37 | (uint)!bVar15 * *(int *)(local_670.ray + 0x368)
                        ;
                        *(uint *)(local_670.ray + 0x36c) =
                             (uint)bVar16 * iVar38 | (uint)!bVar16 * *(int *)(local_670.ray + 0x36c)
                        ;
                        *(uint *)(local_670.ray + 0x370) =
                             (uint)bVar17 * iVar39 | (uint)!bVar17 * *(int *)(local_670.ray + 0x370)
                        ;
                        *(uint *)(local_670.ray + 0x374) =
                             (uint)bVar18 * iVar40 | (uint)!bVar18 * *(int *)(local_670.ray + 0x374)
                        ;
                        *(uint *)(local_670.ray + 0x378) =
                             (uint)bVar19 * iVar41 | (uint)!bVar19 * *(int *)(local_670.ray + 0x378)
                        ;
                        *(uint *)(local_670.ray + 0x37c) =
                             (uint)bVar20 * iVar42 | (uint)!bVar20 * *(int *)(local_670.ray + 0x37c)
                        ;
                        iVar28 = *(int *)(local_670.hit + 0x84);
                        iVar29 = *(int *)(local_670.hit + 0x88);
                        iVar30 = *(int *)(local_670.hit + 0x8c);
                        iVar31 = *(int *)(local_670.hit + 0x90);
                        iVar32 = *(int *)(local_670.hit + 0x94);
                        iVar33 = *(int *)(local_670.hit + 0x98);
                        iVar34 = *(int *)(local_670.hit + 0x9c);
                        iVar35 = *(int *)(local_670.hit + 0xa0);
                        iVar36 = *(int *)(local_670.hit + 0xa4);
                        iVar37 = *(int *)(local_670.hit + 0xa8);
                        iVar38 = *(int *)(local_670.hit + 0xac);
                        iVar39 = *(int *)(local_670.hit + 0xb0);
                        iVar40 = *(int *)(local_670.hit + 0xb4);
                        iVar41 = *(int *)(local_670.hit + 0xb8);
                        iVar42 = *(int *)(local_670.hit + 0xbc);
                        bVar54 = (bool)((byte)(uVar49 >> 1) & 1);
                        bVar55 = (bool)((byte)(uVar49 >> 2) & 1);
                        bVar52 = (bool)((byte)(uVar49 >> 3) & 1);
                        bVar53 = (bool)((byte)(uVar49 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar49 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar49 >> 6) & 1);
                        bVar12 = (bool)((byte)(uVar49 >> 7) & 1);
                        bVar14 = (bool)((byte)(uVar49 >> 9) & 1);
                        bVar15 = (bool)((byte)(uVar49 >> 10) & 1);
                        bVar16 = (bool)((byte)(uVar49 >> 0xb) & 1);
                        bVar17 = (bool)((byte)(uVar49 >> 0xc) & 1);
                        bVar18 = (bool)((byte)(uVar49 >> 0xd) & 1);
                        bVar19 = (bool)((byte)(uVar49 >> 0xe) & 1);
                        bVar20 = SUB81(uVar49 >> 0xf,0);
                        *(uint *)(local_670.ray + 0x380) =
                             (uint)(bVar43 & 1) * *(int *)(local_670.hit + 0x80) |
                             (uint)!(bool)(bVar43 & 1) * *(int *)(local_670.ray + 0x380);
                        *(uint *)(local_670.ray + 900) =
                             (uint)bVar54 * iVar28 | (uint)!bVar54 * *(int *)(local_670.ray + 900);
                        *(uint *)(local_670.ray + 0x388) =
                             (uint)bVar55 * iVar29 | (uint)!bVar55 * *(int *)(local_670.ray + 0x388)
                        ;
                        *(uint *)(local_670.ray + 0x38c) =
                             (uint)bVar52 * iVar30 | (uint)!bVar52 * *(int *)(local_670.ray + 0x38c)
                        ;
                        *(uint *)(local_670.ray + 0x390) =
                             (uint)bVar53 * iVar31 | (uint)!bVar53 * *(int *)(local_670.ray + 0x390)
                        ;
                        *(uint *)(local_670.ray + 0x394) =
                             (uint)bVar10 * iVar32 | (uint)!bVar10 * *(int *)(local_670.ray + 0x394)
                        ;
                        *(uint *)(local_670.ray + 0x398) =
                             (uint)bVar11 * iVar33 | (uint)!bVar11 * *(int *)(local_670.ray + 0x398)
                        ;
                        *(uint *)(local_670.ray + 0x39c) =
                             (uint)bVar12 * iVar34 | (uint)!bVar12 * *(int *)(local_670.ray + 0x39c)
                        ;
                        *(uint *)(local_670.ray + 0x3a0) =
                             (uint)(bVar13 & 1) * iVar35 |
                             (uint)!(bool)(bVar13 & 1) * *(int *)(local_670.ray + 0x3a0);
                        *(uint *)(local_670.ray + 0x3a4) =
                             (uint)bVar14 * iVar36 | (uint)!bVar14 * *(int *)(local_670.ray + 0x3a4)
                        ;
                        *(uint *)(local_670.ray + 0x3a8) =
                             (uint)bVar15 * iVar37 | (uint)!bVar15 * *(int *)(local_670.ray + 0x3a8)
                        ;
                        *(uint *)(local_670.ray + 0x3ac) =
                             (uint)bVar16 * iVar38 | (uint)!bVar16 * *(int *)(local_670.ray + 0x3ac)
                        ;
                        *(uint *)(local_670.ray + 0x3b0) =
                             (uint)bVar17 * iVar39 | (uint)!bVar17 * *(int *)(local_670.ray + 0x3b0)
                        ;
                        *(uint *)(local_670.ray + 0x3b4) =
                             (uint)bVar18 * iVar40 | (uint)!bVar18 * *(int *)(local_670.ray + 0x3b4)
                        ;
                        *(uint *)(local_670.ray + 0x3b8) =
                             (uint)bVar19 * iVar41 | (uint)!bVar19 * *(int *)(local_670.ray + 0x3b8)
                        ;
                        *(uint *)(local_670.ray + 0x3bc) =
                             (uint)bVar20 * iVar42 | (uint)!bVar20 * *(int *)(local_670.ray + 0x3bc)
                        ;
                        iVar28 = *(int *)(local_670.hit + 0xc4);
                        iVar29 = *(int *)(local_670.hit + 200);
                        iVar30 = *(int *)(local_670.hit + 0xcc);
                        iVar31 = *(int *)(local_670.hit + 0xd0);
                        iVar32 = *(int *)(local_670.hit + 0xd4);
                        iVar33 = *(int *)(local_670.hit + 0xd8);
                        iVar34 = *(int *)(local_670.hit + 0xdc);
                        iVar35 = *(int *)(local_670.hit + 0xe0);
                        iVar36 = *(int *)(local_670.hit + 0xe4);
                        iVar37 = *(int *)(local_670.hit + 0xe8);
                        iVar38 = *(int *)(local_670.hit + 0xec);
                        iVar39 = *(int *)(local_670.hit + 0xf0);
                        iVar40 = *(int *)(local_670.hit + 0xf4);
                        iVar41 = *(int *)(local_670.hit + 0xf8);
                        iVar42 = *(int *)(local_670.hit + 0xfc);
                        bVar54 = (bool)((byte)(uVar49 >> 1) & 1);
                        bVar55 = (bool)((byte)(uVar49 >> 2) & 1);
                        bVar52 = (bool)((byte)(uVar49 >> 3) & 1);
                        bVar53 = (bool)((byte)(uVar49 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar49 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar49 >> 6) & 1);
                        bVar12 = (bool)((byte)(uVar49 >> 7) & 1);
                        bVar14 = (bool)((byte)(uVar49 >> 9) & 1);
                        bVar15 = (bool)((byte)(uVar49 >> 10) & 1);
                        bVar16 = (bool)((byte)(uVar49 >> 0xb) & 1);
                        bVar17 = (bool)((byte)(uVar49 >> 0xc) & 1);
                        bVar18 = (bool)((byte)(uVar49 >> 0xd) & 1);
                        bVar19 = (bool)((byte)(uVar49 >> 0xe) & 1);
                        bVar20 = SUB81(uVar49 >> 0xf,0);
                        *(uint *)(local_670.ray + 0x3c0) =
                             (uint)(bVar43 & 1) * *(int *)(local_670.hit + 0xc0) |
                             (uint)!(bool)(bVar43 & 1) * *(int *)(local_670.ray + 0x3c0);
                        *(uint *)(local_670.ray + 0x3c4) =
                             (uint)bVar54 * iVar28 | (uint)!bVar54 * *(int *)(local_670.ray + 0x3c4)
                        ;
                        *(uint *)(local_670.ray + 0x3c8) =
                             (uint)bVar55 * iVar29 | (uint)!bVar55 * *(int *)(local_670.ray + 0x3c8)
                        ;
                        *(uint *)(local_670.ray + 0x3cc) =
                             (uint)bVar52 * iVar30 | (uint)!bVar52 * *(int *)(local_670.ray + 0x3cc)
                        ;
                        *(uint *)(local_670.ray + 0x3d0) =
                             (uint)bVar53 * iVar31 | (uint)!bVar53 * *(int *)(local_670.ray + 0x3d0)
                        ;
                        *(uint *)(local_670.ray + 0x3d4) =
                             (uint)bVar10 * iVar32 | (uint)!bVar10 * *(int *)(local_670.ray + 0x3d4)
                        ;
                        *(uint *)(local_670.ray + 0x3d8) =
                             (uint)bVar11 * iVar33 | (uint)!bVar11 * *(int *)(local_670.ray + 0x3d8)
                        ;
                        *(uint *)(local_670.ray + 0x3dc) =
                             (uint)bVar12 * iVar34 | (uint)!bVar12 * *(int *)(local_670.ray + 0x3dc)
                        ;
                        *(uint *)(local_670.ray + 0x3e0) =
                             (uint)(bVar13 & 1) * iVar35 |
                             (uint)!(bool)(bVar13 & 1) * *(int *)(local_670.ray + 0x3e0);
                        *(uint *)(local_670.ray + 0x3e4) =
                             (uint)bVar14 * iVar36 | (uint)!bVar14 * *(int *)(local_670.ray + 0x3e4)
                        ;
                        *(uint *)(local_670.ray + 1000) =
                             (uint)bVar15 * iVar37 | (uint)!bVar15 * *(int *)(local_670.ray + 1000);
                        *(uint *)(local_670.ray + 0x3ec) =
                             (uint)bVar16 * iVar38 | (uint)!bVar16 * *(int *)(local_670.ray + 0x3ec)
                        ;
                        *(uint *)(local_670.ray + 0x3f0) =
                             (uint)bVar17 * iVar39 | (uint)!bVar17 * *(int *)(local_670.ray + 0x3f0)
                        ;
                        *(uint *)(local_670.ray + 0x3f4) =
                             (uint)bVar18 * iVar40 | (uint)!bVar18 * *(int *)(local_670.ray + 0x3f4)
                        ;
                        *(uint *)(local_670.ray + 0x3f8) =
                             (uint)bVar19 * iVar41 | (uint)!bVar19 * *(int *)(local_670.ray + 0x3f8)
                        ;
                        *(uint *)(local_670.ray + 0x3fc) =
                             (uint)bVar20 * iVar42 | (uint)!bVar20 * *(int *)(local_670.ray + 0x3fc)
                        ;
                        iVar28 = *(int *)(local_670.hit + 0x104);
                        iVar29 = *(int *)(local_670.hit + 0x108);
                        iVar30 = *(int *)(local_670.hit + 0x10c);
                        iVar31 = *(int *)(local_670.hit + 0x110);
                        iVar32 = *(int *)(local_670.hit + 0x114);
                        iVar33 = *(int *)(local_670.hit + 0x118);
                        iVar34 = *(int *)(local_670.hit + 0x11c);
                        iVar35 = *(int *)(local_670.hit + 0x120);
                        iVar36 = *(int *)(local_670.hit + 0x124);
                        iVar37 = *(int *)(local_670.hit + 0x128);
                        iVar38 = *(int *)(local_670.hit + 300);
                        iVar39 = *(int *)(local_670.hit + 0x130);
                        iVar40 = *(int *)(local_670.hit + 0x134);
                        iVar41 = *(int *)(local_670.hit + 0x138);
                        iVar42 = *(int *)(local_670.hit + 0x13c);
                        bVar54 = (bool)((byte)(uVar49 >> 1) & 1);
                        bVar55 = (bool)((byte)(uVar49 >> 2) & 1);
                        bVar52 = (bool)((byte)(uVar49 >> 3) & 1);
                        bVar53 = (bool)((byte)(uVar49 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar49 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar49 >> 6) & 1);
                        bVar12 = (bool)((byte)(uVar49 >> 7) & 1);
                        bVar14 = (bool)((byte)(uVar49 >> 9) & 1);
                        bVar15 = (bool)((byte)(uVar49 >> 10) & 1);
                        bVar16 = (bool)((byte)(uVar49 >> 0xb) & 1);
                        bVar17 = (bool)((byte)(uVar49 >> 0xc) & 1);
                        bVar18 = (bool)((byte)(uVar49 >> 0xd) & 1);
                        bVar19 = (bool)((byte)(uVar49 >> 0xe) & 1);
                        bVar20 = SUB81(uVar49 >> 0xf,0);
                        *(uint *)(local_670.ray + 0x400) =
                             (uint)(bVar43 & 1) * *(int *)(local_670.hit + 0x100) |
                             (uint)!(bool)(bVar43 & 1) * *(int *)(local_670.ray + 0x400);
                        *(uint *)(local_670.ray + 0x404) =
                             (uint)bVar54 * iVar28 | (uint)!bVar54 * *(int *)(local_670.ray + 0x404)
                        ;
                        *(uint *)(local_670.ray + 0x408) =
                             (uint)bVar55 * iVar29 | (uint)!bVar55 * *(int *)(local_670.ray + 0x408)
                        ;
                        *(uint *)(local_670.ray + 0x40c) =
                             (uint)bVar52 * iVar30 | (uint)!bVar52 * *(int *)(local_670.ray + 0x40c)
                        ;
                        *(uint *)(local_670.ray + 0x410) =
                             (uint)bVar53 * iVar31 | (uint)!bVar53 * *(int *)(local_670.ray + 0x410)
                        ;
                        *(uint *)(local_670.ray + 0x414) =
                             (uint)bVar10 * iVar32 | (uint)!bVar10 * *(int *)(local_670.ray + 0x414)
                        ;
                        *(uint *)(local_670.ray + 0x418) =
                             (uint)bVar11 * iVar33 | (uint)!bVar11 * *(int *)(local_670.ray + 0x418)
                        ;
                        *(uint *)(local_670.ray + 0x41c) =
                             (uint)bVar12 * iVar34 | (uint)!bVar12 * *(int *)(local_670.ray + 0x41c)
                        ;
                        *(uint *)(local_670.ray + 0x420) =
                             (uint)(bVar13 & 1) * iVar35 |
                             (uint)!(bool)(bVar13 & 1) * *(int *)(local_670.ray + 0x420);
                        *(uint *)(local_670.ray + 0x424) =
                             (uint)bVar14 * iVar36 | (uint)!bVar14 * *(int *)(local_670.ray + 0x424)
                        ;
                        *(uint *)(local_670.ray + 0x428) =
                             (uint)bVar15 * iVar37 | (uint)!bVar15 * *(int *)(local_670.ray + 0x428)
                        ;
                        *(uint *)(local_670.ray + 0x42c) =
                             (uint)bVar16 * iVar38 | (uint)!bVar16 * *(int *)(local_670.ray + 0x42c)
                        ;
                        *(uint *)(local_670.ray + 0x430) =
                             (uint)bVar17 * iVar39 | (uint)!bVar17 * *(int *)(local_670.ray + 0x430)
                        ;
                        *(uint *)(local_670.ray + 0x434) =
                             (uint)bVar18 * iVar40 | (uint)!bVar18 * *(int *)(local_670.ray + 0x434)
                        ;
                        *(uint *)(local_670.ray + 0x438) =
                             (uint)bVar19 * iVar41 | (uint)!bVar19 * *(int *)(local_670.ray + 0x438)
                        ;
                        *(uint *)(local_670.ray + 0x43c) =
                             (uint)bVar20 * iVar42 | (uint)!bVar20 * *(int *)(local_670.ray + 0x43c)
                        ;
                        auVar116 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_670.hit + 0x140));
                        auVar116 = vmovdqu32_avx512f(auVar116);
                        *(undefined1 (*) [64])(local_670.ray + 0x440) = auVar116;
                        auVar116 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_670.hit + 0x180));
                        auVar116 = vmovdqu32_avx512f(auVar116);
                        *(undefined1 (*) [64])(local_670.ray + 0x480) = auVar116;
                        auVar266 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_670.hit + 0x1c0));
                        auVar116 = vmovdqa32_avx512f(auVar266);
                        *(undefined1 (*) [64])(local_670.ray + 0x4c0) = auVar116;
                        auVar268 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_670.hit + 0x200));
                        bVar54 = (bool)((byte)(uVar49 >> 1) & 1);
                        auVar27._4_56_ = auVar268._8_56_;
                        auVar27._0_4_ =
                             (uint)bVar54 * auVar268._4_4_ | (uint)!bVar54 * auVar266._4_4_;
                        auVar117._0_8_ = auVar27._0_8_ << 0x20;
                        bVar54 = (bool)((byte)(uVar49 >> 2) & 1);
                        auVar117._8_4_ =
                             (uint)bVar54 * auVar268._8_4_ | (uint)!bVar54 * auVar266._8_4_;
                        bVar54 = (bool)((byte)(uVar49 >> 3) & 1);
                        auVar117._12_4_ =
                             (uint)bVar54 * auVar268._12_4_ | (uint)!bVar54 * auVar266._12_4_;
                        bVar54 = (bool)((byte)(uVar49 >> 4) & 1);
                        auVar117._16_4_ =
                             (uint)bVar54 * auVar268._16_4_ | (uint)!bVar54 * auVar266._16_4_;
                        bVar54 = (bool)((byte)(uVar49 >> 5) & 1);
                        auVar117._20_4_ =
                             (uint)bVar54 * auVar268._20_4_ | (uint)!bVar54 * auVar266._20_4_;
                        bVar54 = (bool)((byte)(uVar49 >> 6) & 1);
                        auVar117._24_4_ =
                             (uint)bVar54 * auVar268._24_4_ | (uint)!bVar54 * auVar266._24_4_;
                        bVar54 = (bool)((byte)(uVar49 >> 7) & 1);
                        auVar117._28_4_ =
                             (uint)bVar54 * auVar268._28_4_ | (uint)!bVar54 * auVar266._28_4_;
                        auVar117._32_4_ =
                             (uint)(bVar13 & 1) * auVar268._32_4_ |
                             (uint)!(bool)(bVar13 & 1) * auVar266._32_4_;
                        bVar54 = (bool)((byte)(uVar49 >> 9) & 1);
                        auVar117._36_4_ =
                             (uint)bVar54 * auVar268._36_4_ | (uint)!bVar54 * auVar266._36_4_;
                        bVar54 = (bool)((byte)(uVar49 >> 10) & 1);
                        auVar117._40_4_ =
                             (uint)bVar54 * auVar268._40_4_ | (uint)!bVar54 * auVar266._40_4_;
                        bVar54 = (bool)((byte)(uVar49 >> 0xb) & 1);
                        auVar117._44_4_ =
                             (uint)bVar54 * auVar268._44_4_ | (uint)!bVar54 * auVar266._44_4_;
                        bVar54 = (bool)((byte)(uVar49 >> 0xc) & 1);
                        auVar117._48_4_ =
                             (uint)bVar54 * auVar268._48_4_ | (uint)!bVar54 * auVar266._48_4_;
                        bVar54 = (bool)((byte)(uVar49 >> 0xd) & 1);
                        auVar117._52_4_ =
                             (uint)bVar54 * auVar268._52_4_ | (uint)!bVar54 * auVar266._52_4_;
                        bVar54 = (bool)((byte)(uVar49 >> 0xe) & 1);
                        auVar117._56_4_ =
                             (uint)bVar54 * auVar268._56_4_ | (uint)!bVar54 * auVar266._56_4_;
                        bVar54 = SUB81(uVar49 >> 0xf,0);
                        auVar117._60_4_ =
                             (uint)bVar54 * auVar268._60_4_ | (uint)!bVar54 * auVar266._60_4_;
                        auVar116._16_48_ = auVar117._16_48_;
                        auVar266 = vmovdqa32_avx512f(auVar268);
                        *(undefined1 (*) [64])(local_670.ray + 0x500) = auVar266;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar241;
                    break;
                  }
                  lVar47 = lVar47 + -1;
                } while (lVar47 != 0);
              }
            }
          }
          auVar266 = ZEXT1664(local_630);
          auVar115._16_48_ = auVar116._16_48_;
          auVar115._0_16_ = local_640;
          auVar268 = ZEXT1664(local_640);
          if (uVar44 == 0) break;
        } while( true );
      }
      uVar127 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar26._4_4_ = uVar127;
      auVar26._0_4_ = uVar127;
      auVar26._8_4_ = uVar127;
      auVar26._12_4_ = uVar127;
      uVar21 = vcmpps_avx512vl(local_600,auVar26,2);
      uVar51 = (uint)uVar56 & local_678 & (uint)uVar21;
      uVar56 = (ulong)uVar51;
    } while (uVar51 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }